

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  int iVar44;
  undefined4 uVar45;
  ulong uVar46;
  long lVar47;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  long extraout_RAX_03;
  long extraout_RAX_04;
  long extraout_RAX_05;
  long extraout_RAX_06;
  ulong uVar48;
  byte bVar49;
  int iVar50;
  undefined4 uVar51;
  long lVar52;
  RTCFilterFunctionNArguments *pRVar54;
  long lVar55;
  byte bVar56;
  ulong uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  short sVar66;
  float fVar67;
  float fVar110;
  float fVar111;
  __m128 a_1;
  undefined2 uVar109;
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar112;
  float fVar132;
  float fVar133;
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  float fVar150;
  float fVar151;
  vfloat4 v;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar167;
  float fVar168;
  vfloat4 v_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar187;
  float fVar188;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar196;
  float fVar197;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar206;
  float fVar207;
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  float fVar208;
  float fVar229;
  float fVar230;
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar231;
  float fVar242;
  float fVar243;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar244;
  float fVar251;
  float fVar252;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  float fVar253;
  float fVar256;
  float fVar257;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar259 [16];
  float fVar265;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar276;
  float fVar277;
  undefined1 auVar275 [16];
  vfloat4 a;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  bool local_5d9;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined4 local_59c;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_568;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  undefined4 uStack_51c;
  ulong local_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [16];
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  undefined4 uStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  undefined4 uStack_4ac;
  RTCFilterFunctionNArguments *local_4a0;
  RTCFilterFunctionNArguments local_498;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [12];
  float fStack_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  uint local_40c;
  uint local_408;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  ulong local_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  Primitive *local_278;
  ulong local_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8 [4];
  float afStack_e8 [4];
  float local_d8 [42];
  ulong uVar53;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 uVar108;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar249 [16];
  undefined1 auVar282 [16];
  
  PVar6 = prim[1];
  uVar46 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar46 * 0x19 + 6;
  fVar151 = *(float *)(pPVar5 + 0xc);
  fVar152 = ((ray->org).field_0.m128[0] - *(float *)pPVar5) * fVar151;
  fVar167 = ((ray->org).field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar151;
  fVar168 = ((ray->org).field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar151;
  fVar134 = fVar151 * (ray->dir).field_0.m128[0];
  fVar150 = fVar151 * (ray->dir).field_0.m128[1];
  fVar151 = fVar151 * (ray->dir).field_0.m128[2];
  uVar51 = *(undefined4 *)(prim + uVar46 * 4 + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar57;
  auVar226._12_2_ = uVar109;
  auVar226._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar57;
  auVar225._10_2_ = uVar109;
  auVar234._10_6_ = auVar225._10_6_;
  auVar234._8_2_ = uVar109;
  auVar234._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar29._4_8_ = auVar234._8_8_;
  auVar29._2_2_ = uVar109;
  auVar29._0_2_ = uVar109;
  fVar112 = (float)((int)sVar66 >> 8);
  fVar132 = (float)(auVar29._0_4_ >> 0x18);
  fVar133 = (float)(auVar234._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + uVar46 * 5 + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar57;
  auVar70._12_2_ = uVar109;
  auVar70._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar57;
  auVar69._10_2_ = uVar109;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar109;
  auVar68._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar30._4_8_ = auVar68._8_8_;
  auVar30._2_2_ = uVar109;
  auVar30._0_2_ = uVar109;
  fVar169 = (float)((int)sVar66 >> 8);
  fVar187 = (float)(auVar30._0_4_ >> 0x18);
  fVar188 = (float)(auVar68._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + uVar46 * 6 + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar57;
  auVar73._12_2_ = uVar109;
  auVar73._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar57;
  auVar72._10_2_ = uVar109;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar109;
  auVar71._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar31._4_8_ = auVar71._8_8_;
  auVar31._2_2_ = uVar109;
  auVar31._0_2_ = uVar109;
  fVar189 = (float)((int)sVar66 >> 8);
  fVar196 = (float)(auVar31._0_4_ >> 0x18);
  fVar197 = (float)(auVar71._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + uVar46 * 0xb + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar57;
  auVar76._12_2_ = uVar109;
  auVar76._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar57;
  auVar75._10_2_ = uVar109;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar109;
  auVar74._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar32._4_8_ = auVar74._8_8_;
  auVar32._2_2_ = uVar109;
  auVar32._0_2_ = uVar109;
  fVar67 = (float)((int)sVar66 >> 8);
  fVar110 = (float)(auVar32._0_4_ >> 0x18);
  fVar111 = (float)(auVar74._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar57;
  auVar201._12_2_ = uVar109;
  auVar201._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar57;
  auVar200._10_2_ = uVar109;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar109;
  auVar199._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar33._4_8_ = auVar199._8_8_;
  auVar33._2_2_ = uVar109;
  auVar33._0_2_ = uVar109;
  fVar198 = (float)((int)sVar66 >> 8);
  fVar206 = (float)(auVar33._0_4_ >> 0x18);
  fVar207 = (float)(auVar199._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar46 + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar57;
  auVar211._12_2_ = uVar109;
  auVar211._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar57;
  auVar210._10_2_ = uVar109;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar109;
  auVar209._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar34._4_8_ = auVar209._8_8_;
  auVar34._2_2_ = uVar109;
  auVar34._0_2_ = uVar109;
  fVar244 = (float)((int)sVar66 >> 8);
  fVar251 = (float)(auVar34._0_4_ >> 0x18);
  fVar252 = (float)(auVar209._8_4_ >> 0x18);
  uVar48 = (ulong)(uint)((int)(uVar46 * 9) * 2);
  uVar51 = *(undefined4 *)(prim + uVar48 + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar57;
  auVar214._12_2_ = uVar109;
  auVar214._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar57;
  auVar213._10_2_ = uVar109;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar109;
  auVar212._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar35._4_8_ = auVar212._8_8_;
  auVar35._2_2_ = uVar109;
  auVar35._0_2_ = uVar109;
  fVar231 = (float)((int)sVar66 >> 8);
  fVar242 = (float)(auVar35._0_4_ >> 0x18);
  fVar243 = (float)(auVar212._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + uVar48 + uVar46 + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar57;
  auVar217._12_2_ = uVar109;
  auVar217._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar57;
  auVar216._10_2_ = uVar109;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar109;
  auVar215._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar36._4_8_ = auVar215._8_8_;
  auVar36._2_2_ = uVar109;
  auVar36._0_2_ = uVar109;
  fVar253 = (float)((int)sVar66 >> 8);
  fVar256 = (float)(auVar36._0_4_ >> 0x18);
  fVar257 = (float)(auVar215._8_4_ >> 0x18);
  uVar53 = (ulong)(uint)((int)(uVar46 * 5) << 2);
  uVar51 = *(undefined4 *)(prim + uVar53 + 6);
  uVar108 = (undefined1)((uint)uVar51 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar51 >> 0x10);
  uVar14 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar51));
  uVar108 = (undefined1)((uint)uVar51 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar14 >> 0x20),uVar108),uVar108);
  sVar66 = CONCAT11((char)uVar51,(char)uVar51);
  uVar57 = CONCAT62(uVar28,sVar66);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar57;
  auVar220._12_2_ = uVar109;
  auVar220._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar14 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar57;
  auVar219._10_2_ = uVar109;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar109;
  auVar218._0_8_ = uVar57;
  uVar109 = (undefined2)uVar28;
  auVar37._4_8_ = auVar218._8_8_;
  auVar37._2_2_ = uVar109;
  auVar37._0_2_ = uVar109;
  fVar274 = (float)((int)sVar66 >> 8);
  fVar276 = (float)(auVar37._0_4_ >> 0x18);
  fVar277 = (float)(auVar218._8_4_ >> 0x18);
  fVar266 = fVar134 * fVar112 + fVar150 * fVar169 + fVar151 * fVar189;
  fVar268 = fVar134 * fVar132 + fVar150 * fVar187 + fVar151 * fVar196;
  fVar270 = fVar134 * fVar133 + fVar150 * fVar188 + fVar151 * fVar197;
  fVar272 = fVar134 * (float)(auVar225._12_4_ >> 0x18) +
            fVar150 * (float)(auVar69._12_4_ >> 0x18) + fVar151 * (float)(auVar72._12_4_ >> 0x18);
  fVar258 = fVar134 * fVar67 + fVar150 * fVar198 + fVar151 * fVar244;
  fVar262 = fVar134 * fVar110 + fVar150 * fVar206 + fVar151 * fVar251;
  fVar263 = fVar134 * fVar111 + fVar150 * fVar207 + fVar151 * fVar252;
  fVar264 = fVar134 * (float)(auVar75._12_4_ >> 0x18) +
            fVar150 * (float)(auVar200._12_4_ >> 0x18) + fVar151 * (float)(auVar210._12_4_ >> 0x18);
  fVar208 = fVar134 * fVar231 + fVar150 * fVar253 + fVar151 * fVar274;
  fVar229 = fVar134 * fVar242 + fVar150 * fVar256 + fVar151 * fVar276;
  fVar230 = fVar134 * fVar243 + fVar150 * fVar257 + fVar151 * fVar277;
  fVar134 = fVar134 * (float)(auVar213._12_4_ >> 0x18) +
            fVar150 * (float)(auVar216._12_4_ >> 0x18) + fVar151 * (float)(auVar219._12_4_ >> 0x18);
  fVar169 = fVar112 * fVar152 + fVar169 * fVar167 + fVar189 * fVar168;
  fVar187 = fVar132 * fVar152 + fVar187 * fVar167 + fVar196 * fVar168;
  fVar188 = fVar133 * fVar152 + fVar188 * fVar167 + fVar197 * fVar168;
  fVar189 = (float)(auVar225._12_4_ >> 0x18) * fVar152 +
            (float)(auVar69._12_4_ >> 0x18) * fVar167 + (float)(auVar72._12_4_ >> 0x18) * fVar168;
  fVar244 = fVar67 * fVar152 + fVar198 * fVar167 + fVar244 * fVar168;
  fVar251 = fVar110 * fVar152 + fVar206 * fVar167 + fVar251 * fVar168;
  fVar207 = fVar111 * fVar152 + fVar207 * fVar167 + fVar252 * fVar168;
  fVar252 = (float)(auVar75._12_4_ >> 0x18) * fVar152 +
            (float)(auVar200._12_4_ >> 0x18) * fVar167 + (float)(auVar210._12_4_ >> 0x18) * fVar168;
  fVar196 = fVar152 * fVar231 + fVar167 * fVar253 + fVar168 * fVar274;
  fVar197 = fVar152 * fVar242 + fVar167 * fVar256 + fVar168 * fVar276;
  fVar198 = fVar152 * fVar243 + fVar167 * fVar257 + fVar168 * fVar277;
  fVar206 = fVar152 * (float)(auVar213._12_4_ >> 0x18) +
            fVar167 * (float)(auVar216._12_4_ >> 0x18) + fVar168 * (float)(auVar219._12_4_ >> 0x18);
  fVar151 = (float)DAT_01ff1d40;
  fVar67 = DAT_01ff1d40._4_4_;
  fVar110 = DAT_01ff1d40._8_4_;
  fVar111 = DAT_01ff1d40._12_4_;
  uVar58 = -(uint)(fVar151 <= ABS(fVar266));
  uVar60 = -(uint)(fVar67 <= ABS(fVar268));
  uVar62 = -(uint)(fVar110 <= ABS(fVar270));
  uVar64 = -(uint)(fVar111 <= ABS(fVar272));
  auVar153._0_4_ = ~uVar58 & (uint)fVar151;
  auVar153._4_4_ = ~uVar60 & (uint)fVar67;
  auVar153._8_4_ = ~uVar62 & (uint)fVar110;
  auVar153._12_4_ = ~uVar64 & (uint)fVar111;
  auVar77._4_4_ = (uint)fVar268 & uVar60;
  auVar77._0_4_ = (uint)fVar266 & uVar58;
  auVar77._8_4_ = (uint)fVar270 & uVar62;
  auVar77._12_4_ = (uint)fVar272 & uVar64;
  auVar153 = auVar153 | auVar77;
  uVar58 = -(uint)(fVar151 <= ABS(fVar258));
  uVar60 = -(uint)(fVar67 <= ABS(fVar262));
  uVar62 = -(uint)(fVar110 <= ABS(fVar263));
  uVar64 = -(uint)(fVar111 <= ABS(fVar264));
  auVar259._0_4_ = (uint)fVar258 & uVar58;
  auVar259._4_4_ = (uint)fVar262 & uVar60;
  auVar259._8_4_ = (uint)fVar263 & uVar62;
  auVar259._12_4_ = (uint)fVar264 & uVar64;
  auVar170._0_4_ = ~uVar58 & (uint)fVar151;
  auVar170._4_4_ = ~uVar60 & (uint)fVar67;
  auVar170._8_4_ = ~uVar62 & (uint)fVar110;
  auVar170._12_4_ = ~uVar64 & (uint)fVar111;
  auVar170 = auVar170 | auVar259;
  uVar58 = -(uint)(fVar151 <= ABS(fVar208));
  uVar60 = -(uint)(fVar67 <= ABS(fVar229));
  uVar62 = -(uint)(fVar110 <= ABS(fVar230));
  uVar64 = -(uint)(fVar111 <= ABS(fVar134));
  auVar221._0_4_ = (uint)fVar208 & uVar58;
  auVar221._4_4_ = (uint)fVar229 & uVar60;
  auVar221._8_4_ = (uint)fVar230 & uVar62;
  auVar221._12_4_ = (uint)fVar134 & uVar64;
  auVar232._0_4_ = ~uVar58 & (uint)fVar151;
  auVar232._4_4_ = ~uVar60 & (uint)fVar67;
  auVar232._8_4_ = ~uVar62 & (uint)fVar110;
  auVar232._12_4_ = ~uVar64 & (uint)fVar111;
  auVar232 = auVar232 | auVar221;
  auVar77 = rcpps(_DAT_01ff1d40,auVar153);
  fVar151 = auVar77._0_4_;
  fVar111 = auVar77._4_4_;
  fVar133 = auVar77._8_4_;
  fVar152 = auVar77._12_4_;
  fVar151 = (1.0 - auVar153._0_4_ * fVar151) * fVar151 + fVar151;
  fVar111 = (1.0 - auVar153._4_4_ * fVar111) * fVar111 + fVar111;
  fVar133 = (1.0 - auVar153._8_4_ * fVar133) * fVar133 + fVar133;
  fVar152 = (1.0 - auVar153._12_4_ * fVar152) * fVar152 + fVar152;
  auVar77 = rcpps(auVar77,auVar170);
  fVar67 = auVar77._0_4_;
  fVar112 = auVar77._4_4_;
  fVar134 = auVar77._8_4_;
  fVar167 = auVar77._12_4_;
  fVar67 = (1.0 - auVar170._0_4_ * fVar67) * fVar67 + fVar67;
  fVar112 = (1.0 - auVar170._4_4_ * fVar112) * fVar112 + fVar112;
  fVar134 = (1.0 - auVar170._8_4_ * fVar134) * fVar134 + fVar134;
  fVar167 = (1.0 - auVar170._12_4_ * fVar167) * fVar167 + fVar167;
  auVar77 = rcpps(auVar77,auVar232);
  fVar110 = auVar77._0_4_;
  fVar132 = auVar77._4_4_;
  fVar150 = auVar77._8_4_;
  fVar168 = auVar77._12_4_;
  fVar110 = (1.0 - auVar232._0_4_ * fVar110) * fVar110 + fVar110;
  fVar132 = (1.0 - auVar232._4_4_ * fVar132) * fVar132 + fVar132;
  fVar150 = (1.0 - auVar232._8_4_ * fVar150) * fVar150 + fVar150;
  fVar168 = (1.0 - auVar232._12_4_ * fVar168) * fVar168 + fVar168;
  uVar57 = *(ulong *)(prim + uVar46 * 7 + 6);
  uVar109 = (undefined2)(uVar57 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar57;
  auVar80._12_2_ = uVar109;
  auVar80._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar57 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar57;
  auVar79._10_2_ = uVar109;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar109;
  auVar78._0_8_ = uVar57;
  uVar109 = (undefined2)(uVar57 >> 0x10);
  auVar38._4_8_ = auVar78._8_8_;
  auVar38._2_2_ = uVar109;
  auVar38._0_2_ = uVar109;
  auVar154._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar187) * fVar111,
                ((float)(int)(short)uVar57 - fVar169) * fVar151);
  auVar154._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar188) * fVar133;
  auVar154._12_4_ = ((float)(auVar79._12_4_ >> 0x10) - fVar189) * fVar152;
  uVar57 = *(ulong *)(prim + uVar46 * 9 + 6);
  uVar109 = (undefined2)(uVar57 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar57;
  auVar83._12_2_ = uVar109;
  auVar83._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar57 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar57;
  auVar82._10_2_ = uVar109;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar109;
  auVar81._0_8_ = uVar57;
  uVar109 = (undefined2)(uVar57 >> 0x10);
  auVar39._4_8_ = auVar81._8_8_;
  auVar39._2_2_ = uVar109;
  auVar39._0_2_ = uVar109;
  auVar171._0_4_ = ((float)(int)(short)uVar57 - fVar169) * fVar151;
  auVar171._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar187) * fVar111;
  auVar171._8_4_ = ((float)(auVar81._8_4_ >> 0x10) - fVar188) * fVar133;
  auVar171._12_4_ = ((float)(auVar82._12_4_ >> 0x10) - fVar189) * fVar152;
  uVar57 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar48 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar46 * -2 + 6);
  uVar109 = (undefined2)(uVar48 >> 0x30);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar48;
  auVar115._12_2_ = uVar109;
  auVar115._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar48 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar48;
  auVar114._10_2_ = uVar109;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar109;
  auVar113._0_8_ = uVar48;
  uVar109 = (undefined2)(uVar48 >> 0x10);
  auVar40._4_8_ = auVar113._8_8_;
  auVar40._2_2_ = uVar109;
  auVar40._0_2_ = uVar109;
  auVar116._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar251) * fVar112,
                ((float)(int)(short)uVar48 - fVar244) * fVar67);
  auVar116._8_4_ = ((float)(auVar113._8_4_ >> 0x10) - fVar207) * fVar134;
  auVar116._12_4_ = ((float)(auVar114._12_4_ >> 0x10) - fVar252) * fVar167;
  uVar109 = (undefined2)(uVar57 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar57;
  auVar86._12_2_ = uVar109;
  auVar86._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar57 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar57;
  auVar85._10_2_ = uVar109;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar109;
  auVar84._0_8_ = uVar57;
  uVar109 = (undefined2)(uVar57 >> 0x10);
  auVar41._4_8_ = auVar84._8_8_;
  auVar41._2_2_ = uVar109;
  auVar41._0_2_ = uVar109;
  auVar222._0_4_ = ((float)(int)(short)uVar57 - fVar244) * fVar67;
  auVar222._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar251) * fVar112;
  auVar222._8_4_ = ((float)(auVar84._8_4_ >> 0x10) - fVar207) * fVar134;
  auVar222._12_4_ = ((float)(auVar85._12_4_ >> 0x10) - fVar252) * fVar167;
  uVar57 = *(ulong *)(prim + uVar53 + uVar46 + 6);
  uVar109 = (undefined2)(uVar57 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar57;
  auVar89._12_2_ = uVar109;
  auVar89._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar57 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar57;
  auVar88._10_2_ = uVar109;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar109;
  auVar87._0_8_ = uVar57;
  uVar109 = (undefined2)(uVar57 >> 0x10);
  auVar42._4_8_ = auVar87._8_8_;
  auVar42._2_2_ = uVar109;
  auVar42._0_2_ = uVar109;
  auVar90._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar197) * fVar132,
                ((float)(int)(short)uVar57 - fVar196) * fVar110);
  auVar90._8_4_ = ((float)(auVar87._8_4_ >> 0x10) - fVar198) * fVar150;
  auVar90._12_4_ = ((float)(auVar88._12_4_ >> 0x10) - fVar206) * fVar168;
  uVar57 = *(ulong *)(prim + uVar46 * 0x17 + 6);
  uVar109 = (undefined2)(uVar57 >> 0x30);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar57;
  auVar204._12_2_ = uVar109;
  auVar204._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar57 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar57;
  auVar203._10_2_ = uVar109;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar109;
  auVar202._0_8_ = uVar57;
  uVar109 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar202._8_8_;
  auVar43._2_2_ = uVar109;
  auVar43._0_2_ = uVar109;
  auVar205._0_4_ = ((float)(int)(short)uVar57 - fVar196) * fVar110;
  auVar205._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar197) * fVar132;
  auVar205._8_4_ = ((float)(auVar202._8_4_ >> 0x10) - fVar198) * fVar150;
  auVar205._12_4_ = ((float)(auVar203._12_4_ >> 0x10) - fVar206) * fVar168;
  auVar233._8_4_ = auVar154._8_4_;
  auVar233._0_8_ = auVar154._0_8_;
  auVar233._12_4_ = auVar154._12_4_;
  auVar234 = minps(auVar233,auVar171);
  auVar135._8_4_ = auVar116._8_4_;
  auVar135._0_8_ = auVar116._0_8_;
  auVar135._12_4_ = auVar116._12_4_;
  auVar77 = minps(auVar135,auVar222);
  auVar234 = maxps(auVar234,auVar77);
  auVar136._8_4_ = auVar90._8_4_;
  auVar136._0_8_ = auVar90._0_8_;
  auVar136._12_4_ = auVar90._12_4_;
  auVar77 = minps(auVar136,auVar205);
  uVar51 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar190._4_4_ = uVar51;
  auVar190._0_4_ = uVar51;
  auVar190._8_4_ = uVar51;
  auVar190._12_4_ = uVar51;
  auVar77 = maxps(auVar77,auVar190);
  auVar77 = maxps(auVar234,auVar77);
  local_228 = auVar77._0_4_ * 0.99999964;
  fStack_224 = auVar77._4_4_ * 0.99999964;
  fStack_220 = auVar77._8_4_ * 0.99999964;
  fStack_21c = auVar77._12_4_ * 0.99999964;
  auVar234 = maxps(auVar154,auVar171);
  auVar77 = maxps(auVar116,auVar222);
  auVar234 = minps(auVar234,auVar77);
  auVar77 = maxps(auVar90,auVar205);
  fVar151 = ray->tfar;
  auVar117._4_4_ = fVar151;
  auVar117._0_4_ = fVar151;
  auVar117._8_4_ = fVar151;
  auVar117._12_4_ = fVar151;
  auVar77 = minps(auVar77,auVar117);
  auVar77 = minps(auVar234,auVar77);
  auVar118._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_228 <= auVar77._0_4_ * 1.0000004);
  auVar118._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_224 <= auVar77._4_4_ * 1.0000004);
  auVar118._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_220 <= auVar77._8_4_ * 1.0000004);
  auVar118._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_21c <= auVar77._12_4_ * 1.0000004);
  uVar58 = movmskps((uint)(byte)PVar6,auVar118);
  local_5d9 = uVar58 != 0;
  if (uVar58 == 0) {
    return local_5d9;
  }
  uVar58 = uVar58 & 0xff;
  local_1b8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1b8._12_4_ = 0;
  local_278 = prim;
LAB_00b77df8:
  uVar57 = (ulong)uVar58;
  lVar52 = 0;
  if (uVar57 != 0) {
    for (; (uVar58 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
    }
  }
  uVar57 = uVar57 - 1 & uVar57;
  local_510 = (ulong)*(uint *)(local_278 + 2);
  pGVar7 = (context->scene->geometries).items[local_510].ptr;
  local_340 = (ulong)*(uint *)(local_278 + lVar52 * 4 + 6);
  uVar48 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(local_278 + lVar52 * 4 + 6));
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar52 = 0;
  if (uVar57 != 0) {
    for (; (uVar57 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
    }
  }
  lVar52 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar52 + (long)p_Var8 * uVar48);
  pfVar2 = (float *)(lVar52 + (uVar48 + 1) * (long)p_Var8);
  pfVar3 = (float *)(lVar52 + (uVar48 + 2) * (long)p_Var8);
  pfVar4 = (float *)(lVar52 + (uVar48 + 3) * (long)p_Var8);
  pRVar54 = (RTCFilterFunctionNArguments *)(uVar57 - 1);
  if ((uVar57 != 0) &&
     (pRVar54 = (RTCFilterFunctionNArguments *)((ulong)pRVar54 & uVar57),
     pRVar54 != (RTCFilterFunctionNArguments *)0x0)) {
    lVar47 = 0;
    if (pRVar54 != (RTCFilterFunctionNArguments *)0x0) {
      for (; ((ulong)pRVar54 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
      }
    }
    pRVar54 = (RTCFilterFunctionNArguments *)(ulong)*(uint *)(local_278 + lVar47 * 4 + 6);
  }
  local_270 = uVar57;
  local_458 = (ray->org).field_0.m128[0];
  fStack_454 = (ray->org).field_0.m128[1];
  fStack_450 = (ray->org).field_0.m128[2];
  local_2c8 = (ray->dir).field_0.m128[0];
  local_328 = (ray->dir).field_0.m128[1];
  local_3d8 = (ray->dir).field_0.m128[2];
  fVar151 = (ray->dir).field_0.m128[3];
  fStack_11c = local_2c8 * local_2c8;
  fVar110 = local_328 * local_328;
  fVar111 = local_3d8 * local_3d8;
  fVar151 = fVar151 * fVar151;
  fVar67 = fStack_11c + fVar110 + fVar111;
  auVar172._0_8_ = CONCAT44(fVar110 + fVar110 + fVar151,fVar67);
  auVar172._8_4_ = fVar111 + fVar110 + fVar111;
  auVar172._12_4_ = fVar151 + fVar110 + fVar151;
  auVar155._8_4_ = auVar172._8_4_;
  auVar155._0_8_ = auVar172._0_8_;
  auVar155._12_4_ = auVar172._12_4_;
  auVar77 = rcpss(auVar155,auVar172);
  local_558 = (2.0 - fVar67 * auVar77._0_4_) * auVar77._0_4_ *
              (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 - fStack_450) * local_3d8 +
              ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 - fStack_454) * local_328 +
              ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - local_458) * local_2c8);
  local_2a8 = ZEXT416((uint)local_558);
  local_458 = local_2c8 * local_558 + local_458;
  fStack_454 = local_328 * local_558 + fStack_454;
  fStack_450 = local_3d8 * local_558 + fStack_450;
  local_508 = *pfVar1 - local_458;
  fStack_504 = pfVar1[1] - fStack_454;
  fStack_500 = pfVar1[2] - fStack_450;
  fStack_4fc = pfVar1[3] - 0.0;
  local_448 = *pfVar3 - local_458;
  fStack_444 = pfVar3[1] - fStack_454;
  fStack_440 = pfVar3[2] - fStack_450;
  fStack_43c = pfVar3[3] - 0.0;
  local_438 = *pfVar2 - local_458;
  fStack_434 = pfVar2[1] - fStack_454;
  local_548 = pfVar2[2] - fStack_450;
  local_4f8 = pfVar2[3] - 0.0;
  local_458 = *pfVar4 - local_458;
  fStack_454 = pfVar4[1] - fStack_454;
  fStack_450 = pfVar4[2] - fStack_450;
  fStack_44c = pfVar4[3] - 0.0;
  local_138 = local_438;
  fStack_134 = local_438;
  fStack_130 = local_438;
  fStack_12c = local_438;
  local_148 = local_448;
  fStack_144 = local_448;
  fStack_140 = local_448;
  fStack_13c = local_448;
  local_158 = fStack_444;
  fStack_154 = fStack_444;
  fStack_150 = fStack_444;
  fStack_14c = fStack_444;
  local_168 = fStack_440;
  fStack_164 = fStack_440;
  fStack_160 = fStack_440;
  fStack_15c = fStack_440;
  local_128 = fStack_11c + fVar111 + fVar110;
  fStack_124 = fStack_11c + fVar111 + fVar110;
  fStack_120 = fStack_11c + fVar111 + fVar110;
  fStack_11c = fStack_11c + fVar111 + fVar110;
  local_178 = local_458;
  fStack_174 = local_458;
  fStack_170 = local_458;
  fStack_16c = local_458;
  local_188 = fStack_454;
  fStack_184 = fStack_454;
  fStack_180 = fStack_454;
  fStack_17c = fStack_454;
  local_198 = fStack_450;
  fStack_194 = fStack_450;
  fStack_190 = fStack_450;
  fStack_18c = fStack_450;
  local_1a8 = fStack_44c;
  fStack_1a4 = fStack_44c;
  fStack_1a0 = fStack_44c;
  fStack_19c = fStack_44c;
  fStack_2c4 = local_2c8;
  fStack_2c0 = local_2c8;
  fStack_2bc = local_2c8;
  fStack_324 = local_328;
  fStack_320 = local_328;
  fStack_31c = local_328;
  fStack_3d4 = local_3d8;
  fStack_3d0 = local_3d8;
  fStack_3cc = local_3d8;
  local_268 = ABS(local_128);
  fStack_264 = ABS(fStack_124);
  fStack_260 = ABS(fStack_120);
  fStack_25c = ABS(fStack_11c);
  lVar47 = 1;
  local_4a0 = (RTCFilterFunctionNArguments *)0x1;
  uVar48 = 0;
  bVar49 = 0;
  local_2b8._0_4_ = 0.0;
  local_2b8._4_4_ = 1.0;
  uStack_2b0._0_4_ = 0;
  uStack_2b0._4_4_ = 0;
  local_1c8 = local_508;
  fStack_1c4 = local_508;
  fStack_1c0 = local_508;
  fStack_1bc = local_508;
  local_1d8 = fStack_504;
  fStack_1d4 = fStack_504;
  fStack_1d0 = fStack_504;
  fStack_1cc = fStack_504;
  local_1e8 = fStack_500;
  fStack_1e4 = fStack_500;
  fStack_1e0 = fStack_500;
  fStack_1dc = fStack_500;
  local_1f8 = fStack_4fc;
  fStack_1f4 = fStack_4fc;
  fStack_1f0 = fStack_4fc;
  fStack_1ec = fStack_4fc;
  local_208 = fStack_434;
  fStack_204 = fStack_434;
  fStack_200 = fStack_434;
  fStack_1fc = fStack_434;
  local_258 = fStack_43c;
  fStack_254 = fStack_43c;
  fStack_250 = fStack_43c;
  fStack_24c = fStack_43c;
  fStack_554 = local_558;
  fStack_550 = local_558;
  fStack_54c = local_558;
  fStack_544 = local_548;
  fStack_540 = local_548;
  fStack_53c = local_548;
  fStack_4f4 = local_4f8;
  fStack_4f0 = local_4f8;
  fStack_4ec = local_4f8;
  fStack_430 = local_548;
  fStack_42c = local_4f8;
  do {
    local_368 = local_2b8._4_4_ - (float)local_2b8;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    local_378 = (float)local_2b8;
    fStack_374 = (float)local_2b8;
    fStack_370 = (float)local_2b8;
    fStack_36c = (float)local_2b8;
    fVar112 = local_368 * 0.0 + (float)local_2b8;
    fVar132 = local_368 * 0.33333334 + (float)local_2b8;
    fVar133 = local_368 * 0.6666667 + (float)local_2b8;
    fVar134 = local_368 * 1.0 + (float)local_2b8;
    fVar150 = (float)DAT_01feca10;
    fVar152 = fVar150 - fVar112;
    fVar168 = DAT_01feca10._4_4_;
    fVar167 = fVar168 - fVar132;
    fVar187 = DAT_01feca10._8_4_;
    fVar188 = DAT_01feca10._12_4_;
    fVar169 = fVar187 - fVar133;
    fVar189 = fVar188 - fVar134;
    fVar207 = local_138 * fVar152 + local_148 * fVar112;
    fVar208 = fStack_134 * fVar167 + fStack_144 * fVar132;
    fVar229 = fStack_130 * fVar169 + fStack_140 * fVar133;
    fVar230 = fStack_12c * fVar189 + fStack_13c * fVar134;
    fVar264 = local_208 * fVar152 + local_158 * fVar112;
    fVar268 = fStack_204 * fVar167 + fStack_154 * fVar132;
    fVar270 = fStack_200 * fVar169 + fStack_150 * fVar133;
    fVar272 = fStack_1fc * fVar189 + fStack_14c * fVar134;
    fVar274 = local_548 * fVar152 + local_168 * fVar112;
    fVar276 = fStack_544 * fVar167 + fStack_164 * fVar132;
    fVar277 = fStack_540 * fVar169 + fStack_160 * fVar133;
    fVar265 = fStack_53c * fVar189 + fStack_15c * fVar134;
    fVar257 = local_4f8 * fVar152 + local_258 * fVar112;
    fVar258 = fStack_4f4 * fVar167 + fStack_254 * fVar132;
    fVar262 = fStack_4f0 * fVar169 + fStack_250 * fVar133;
    fVar263 = fStack_4ec * fVar189 + fStack_24c * fVar134;
    fVar151 = (local_1c8 * fVar152 + local_138 * fVar112) * fVar152 + fVar112 * fVar207;
    fVar67 = (fStack_1c4 * fVar167 + fStack_134 * fVar132) * fVar167 + fVar132 * fVar208;
    fVar110 = (fStack_1c0 * fVar169 + fStack_130 * fVar133) * fVar169 + fVar133 * fVar229;
    fVar111 = (fStack_1bc * fVar189 + fStack_12c * fVar134) * fVar189 + fVar134 * fVar230;
    fVar196 = (local_1d8 * fVar152 + local_208 * fVar112) * fVar152 + fVar112 * fVar264;
    fVar197 = (fStack_1d4 * fVar167 + fStack_204 * fVar132) * fVar167 + fVar132 * fVar268;
    fVar198 = (fStack_1d0 * fVar169 + fStack_200 * fVar133) * fVar169 + fVar133 * fVar270;
    fVar206 = (fStack_1cc * fVar189 + fStack_1fc * fVar134) * fVar189 + fVar134 * fVar272;
    fVar231 = (local_1e8 * fVar152 + local_548 * fVar112) * fVar152 + fVar112 * fVar274;
    fVar242 = (fStack_1e4 * fVar167 + fStack_544 * fVar132) * fVar167 + fVar132 * fVar276;
    fVar243 = (fStack_1e0 * fVar169 + fStack_540 * fVar133) * fVar169 + fVar133 * fVar277;
    fVar244 = (fStack_1dc * fVar189 + fStack_53c * fVar134) * fVar189 + fVar134 * fVar265;
    fVar251 = (local_1f8 * fVar152 + local_4f8 * fVar112) * fVar152 + fVar112 * fVar257;
    fVar252 = (fStack_1f4 * fVar167 + fStack_4f4 * fVar132) * fVar167 + fVar132 * fVar258;
    fVar253 = (fStack_1f0 * fVar169 + fStack_4f0 * fVar133) * fVar169 + fVar133 * fVar262;
    fVar256 = (fStack_1ec * fVar189 + fStack_4ec * fVar134) * fVar189 + fVar134 * fVar263;
    fVar207 = fVar207 * fVar152 + (local_148 * fVar152 + local_178 * fVar112) * fVar112;
    fVar208 = fVar208 * fVar167 + (fStack_144 * fVar167 + fStack_174 * fVar132) * fVar132;
    fVar229 = fVar229 * fVar169 + (fStack_140 * fVar169 + fStack_170 * fVar133) * fVar133;
    fVar230 = fVar230 * fVar189 + (fStack_13c * fVar189 + fStack_16c * fVar134) * fVar134;
    fVar266 = fVar264 * fVar152 + (local_158 * fVar152 + local_188 * fVar112) * fVar112;
    fVar268 = fVar268 * fVar167 + (fStack_154 * fVar167 + fStack_184 * fVar132) * fVar132;
    fVar270 = fVar270 * fVar169 + (fStack_150 * fVar169 + fStack_180 * fVar133) * fVar133;
    fVar272 = fVar272 * fVar189 + (fStack_14c * fVar189 + fStack_17c * fVar134) * fVar134;
    fVar274 = fVar274 * fVar152 + (local_168 * fVar152 + local_198 * fVar112) * fVar112;
    fVar276 = fVar276 * fVar167 + (fStack_164 * fVar167 + fStack_194 * fVar132) * fVar132;
    fVar277 = fVar277 * fVar169 + (fStack_160 * fVar169 + fStack_190 * fVar133) * fVar133;
    fVar265 = fVar265 * fVar189 + (fStack_15c * fVar189 + fStack_18c * fVar134) * fVar134;
    fVar257 = fVar257 * fVar152 + (local_258 * fVar152 + local_1a8 * fVar112) * fVar112;
    fVar258 = fVar258 * fVar167 + (fStack_254 * fVar167 + fStack_1a4 * fVar132) * fVar132;
    fVar262 = fVar262 * fVar169 + (fStack_250 * fVar169 + fStack_1a0 * fVar133) * fVar133;
    fVar263 = fVar263 * fVar189 + (fStack_24c * fVar189 + fStack_19c * fVar134) * fVar134;
    local_3a8._0_4_ = fVar152 * fVar151 + fVar112 * fVar207;
    local_3a8._4_4_ = fVar167 * fVar67 + fVar132 * fVar208;
    fStack_3a0 = fVar169 * fVar110 + fVar133 * fVar229;
    fStack_39c = fVar189 * fVar111 + fVar134 * fVar230;
    local_588 = fVar152 * fVar196 + fVar112 * fVar266;
    fStack_584 = fVar167 * fVar197 + fVar132 * fVar268;
    fStack_580 = fVar169 * fVar198 + fVar133 * fVar270;
    fStack_57c = fVar189 * fVar206 + fVar134 * fVar272;
    fVar267 = fVar152 * fVar231 + fVar112 * fVar274;
    fVar269 = fVar167 * fVar242 + fVar132 * fVar276;
    fVar271 = fVar169 * fVar243 + fVar133 * fVar277;
    fVar273 = fVar189 * fVar244 + fVar134 * fVar265;
    fVar264 = local_368 * 0.11111111;
    fVar112 = fVar152 * fVar251 + fVar112 * fVar257;
    fVar132 = fVar167 * fVar252 + fVar132 * fVar258;
    auVar137._0_8_ = CONCAT44(fVar132,fVar112);
    auVar137._8_4_ = fVar169 * fVar253 + fVar133 * fVar262;
    auVar137._12_4_ = fVar189 * fVar256 + fVar134 * fVar263;
    local_598._0_4_ = (fVar207 - fVar151) * 3.0 * fVar264;
    local_528 = (fVar208 - fVar67) * 3.0 * fVar264;
    fStack_524 = (fVar229 - fVar110) * 3.0 * fVar264;
    fStack_520 = (fVar230 - fVar111) * 3.0 * fVar264;
    fVar207 = (fVar266 - fVar196) * 3.0 * fVar264;
    local_4d8 = (fVar268 - fVar197) * 3.0 * fVar264;
    fStack_4d4 = (fVar270 - fVar198) * 3.0 * fVar264;
    fStack_4d0 = (fVar272 - fVar206) * 3.0 * fVar264;
    auVar260._0_4_ = (fVar274 - fVar231) * 3.0 * fVar264;
    auVar260._4_4_ = (fVar276 - fVar242) * 3.0 * fVar264;
    auVar260._8_4_ = (fVar277 - fVar243) * 3.0 * fVar264;
    auVar260._12_4_ = (fVar265 - fVar244) * 3.0 * fVar264;
    fVar151 = fVar264 * (fVar258 - fVar252) * 3.0;
    fVar67 = fVar264 * (fVar262 - fVar253) * 3.0;
    fVar110 = fVar264 * (fVar263 - fVar256) * 3.0;
    local_4b8._4_4_ = fStack_3a0;
    local_4b8._0_4_ = local_3a8._4_4_;
    fStack_4b0 = fStack_39c;
    uStack_4ac = 0;
    local_4c8._4_4_ = fStack_580;
    local_4c8._0_4_ = fStack_584;
    fStack_4c0 = fStack_57c;
    fStack_4bc = 0.0;
    local_358._4_4_ = fVar271;
    local_358._0_4_ = fVar269;
    fStack_350 = fVar273;
    fStack_34c = 0.0;
    auVar91._4_4_ = auVar137._8_4_;
    auVar91._0_4_ = fVar132;
    auVar91._8_4_ = auVar137._12_4_;
    auVar91._12_4_ = 0;
    local_5d8._4_4_ = fVar132 + fVar151;
    local_5d8._0_4_ = fVar112 + fVar264 * (fVar257 - fVar251) * 3.0;
    fStack_5d0 = auVar137._8_4_ + fVar67;
    fStack_5cc = auVar137._12_4_ + fVar110;
    auVar119._0_8_ = CONCAT44(auVar137._8_4_ - fVar67,fVar132 - fVar151);
    auVar119._8_4_ = auVar137._12_4_ - fVar110;
    auVar119._12_4_ = 0;
    local_3b8 = fStack_584 - local_588;
    fStack_3b4 = fStack_580 - fStack_584;
    fStack_3b0 = fStack_57c - fStack_580;
    fStack_3ac = 0.0 - fStack_57c;
    local_3c8 = fVar269 - fVar267;
    fStack_3c4 = fVar271 - fVar269;
    fStack_3c0 = fVar273 - fVar271;
    fStack_3bc = 0.0 - fVar273;
    fVar151 = fVar207 * local_3c8 - auVar260._0_4_ * local_3b8;
    fVar67 = local_4d8 * fStack_3c4 - auVar260._4_4_ * fStack_3b4;
    fVar110 = fStack_4d4 * fStack_3c0 - auVar260._8_4_ * fStack_3b0;
    fVar111 = fStack_4d0 * fStack_3bc - auVar260._12_4_ * fStack_3ac;
    local_3e8._0_4_ = (float)local_3a8._4_4_ - (float)local_3a8._0_4_;
    local_3e8._4_4_ = fStack_3a0 - (float)local_3a8._4_4_;
    fStack_3e0 = fStack_39c - fStack_3a0;
    fStack_3dc = 0.0 - fStack_39c;
    fVar112 = auVar260._0_4_ * (float)local_3e8._0_4_ - (float)local_598._0_4_ * local_3c8;
    fVar133 = auVar260._4_4_ * (float)local_3e8._4_4_ - local_528 * fStack_3c4;
    fVar152 = auVar260._8_4_ * fStack_3e0 - fStack_524 * fStack_3c0;
    fVar169 = auVar260._12_4_ * fStack_3dc - fStack_520 * fStack_3bc;
    fVar132 = (float)local_598._0_4_ * local_3b8 - fVar207 * (float)local_3e8._0_4_;
    fVar134 = local_528 * fStack_3b4 - local_4d8 * (float)local_3e8._4_4_;
    fVar167 = fStack_524 * fStack_3b0 - fStack_4d4 * fStack_3e0;
    fVar189 = fStack_520 * fStack_3ac - fStack_4d0 * fStack_3dc;
    auVar223._0_4_ = fVar132 * fVar132;
    auVar223._4_4_ = fVar134 * fVar134;
    auVar223._8_4_ = fVar167 * fVar167;
    auVar223._12_4_ = fVar189 * fVar189;
    auVar156._0_4_ =
         (float)local_3e8._0_4_ * (float)local_3e8._0_4_ +
         local_3b8 * local_3b8 + local_3c8 * local_3c8;
    auVar156._4_4_ =
         (float)local_3e8._4_4_ * (float)local_3e8._4_4_ +
         fStack_3b4 * fStack_3b4 + fStack_3c4 * fStack_3c4;
    auVar156._8_4_ = fStack_3e0 * fStack_3e0 + fStack_3b0 * fStack_3b0 + fStack_3c0 * fStack_3c0;
    auVar156._12_4_ = fStack_3dc * fStack_3dc + fStack_3ac * fStack_3ac + fStack_3bc * fStack_3bc;
    auVar77 = rcpps(auVar223,auVar156);
    fVar132 = auVar77._0_4_;
    fVar134 = auVar77._4_4_;
    fVar167 = auVar77._8_4_;
    fVar189 = auVar77._12_4_;
    fVar132 = (1.0 - fVar132 * auVar156._0_4_) * fVar132 + fVar132;
    fVar134 = (1.0 - fVar134 * auVar156._4_4_) * fVar134 + fVar134;
    fVar167 = (1.0 - fVar167 * auVar156._8_4_) * fVar167 + fVar167;
    fVar189 = (1.0 - fVar189 * auVar156._12_4_) * fVar189 + fVar189;
    _local_538 = auVar260 >> 0x20;
    fVar196 = local_3c8 * local_4d8 - local_3b8 * auVar260._4_4_;
    fVar197 = fStack_3c4 * fStack_4d4 - fStack_3b4 * auVar260._8_4_;
    fVar198 = fStack_3c0 * fStack_4d0 - fStack_3b0 * auVar260._12_4_;
    fVar206 = fStack_3bc * 0.0 - fStack_3ac * 0.0;
    local_598._4_4_ = local_528;
    fStack_590 = fStack_524;
    fStack_58c = fStack_520;
    fVar208 = (float)local_3e8._0_4_ * auVar260._4_4_ - local_3c8 * local_528;
    fVar229 = (float)local_3e8._4_4_ * auVar260._8_4_ - fStack_3c4 * fStack_524;
    fVar230 = fStack_3e0 * auVar260._12_4_ - fStack_3c0 * fStack_520;
    fVar231 = fStack_3dc * 0.0 - fStack_3bc * 0.0;
    uStack_4cc = 0;
    uStack_51c = 0;
    fVar242 = local_3b8 * local_528 - (float)local_3e8._0_4_ * local_4d8;
    fVar243 = fStack_3b4 * fStack_524 - (float)local_3e8._4_4_ * fStack_4d4;
    fVar244 = fStack_3b0 * fStack_520 - fStack_3e0 * fStack_4d0;
    fVar251 = fStack_3ac * 0.0 - fStack_3dc * 0.0;
    auVar92._0_4_ = (fVar151 * fVar151 + fVar112 * fVar112 + auVar223._0_4_) * fVar132;
    auVar92._4_4_ = (fVar67 * fVar67 + fVar133 * fVar133 + auVar223._4_4_) * fVar134;
    auVar92._8_4_ = (fVar110 * fVar110 + fVar152 * fVar152 + auVar223._8_4_) * fVar167;
    auVar92._12_4_ = (fVar111 * fVar111 + fVar169 * fVar169 + auVar223._12_4_) * fVar189;
    auVar235._0_4_ = (fVar196 * fVar196 + fVar208 * fVar208 + fVar242 * fVar242) * fVar132;
    auVar235._4_4_ = (fVar197 * fVar197 + fVar229 * fVar229 + fVar243 * fVar243) * fVar134;
    auVar235._8_4_ = (fVar198 * fVar198 + fVar230 * fVar230 + fVar244 * fVar244) * fVar167;
    auVar235._12_4_ = (fVar206 * fVar206 + fVar231 * fVar231 + fVar251 * fVar251) * fVar189;
    auVar77 = maxps(auVar92,auVar235);
    auVar224._8_4_ = auVar137._8_4_;
    auVar224._0_8_ = auVar137._0_8_;
    auVar224._12_4_ = auVar137._12_4_;
    auVar225 = maxps(auVar224,_local_5d8);
    auVar191._8_4_ = auVar119._8_4_;
    auVar191._0_8_ = auVar119._0_8_;
    auVar191._12_4_ = 0;
    auVar234 = maxps(auVar191,auVar91);
    auVar226 = maxps(auVar225,auVar234);
    auVar225 = minps(auVar137,_local_5d8);
    auVar234 = minps(auVar119,auVar91);
    auVar234 = minps(auVar225,auVar234);
    auVar77 = sqrtps(auVar77,auVar77);
    auVar225 = rsqrtps(_local_538,auVar156);
    fVar151 = auVar225._0_4_;
    fVar67 = auVar225._4_4_;
    fVar110 = auVar225._8_4_;
    fVar111 = auVar225._12_4_;
    local_2f8 = fVar151 * fVar151 * auVar156._0_4_ * -0.5 * fVar151 + fVar151 * 1.5;
    fStack_2f4 = fVar67 * fVar67 * auVar156._4_4_ * -0.5 * fVar67 + fVar67 * 1.5;
    fStack_2f0 = fVar110 * fVar110 * auVar156._8_4_ * -0.5 * fVar110 + fVar110 * 1.5;
    fStack_2ec = fVar111 * fVar111 * auVar156._12_4_ * -0.5 * fVar111 + fVar111 * 1.5;
    fVar196 = 0.0 - local_588;
    fVar197 = 0.0 - fStack_584;
    fVar198 = 0.0 - fStack_580;
    fVar206 = 0.0 - fStack_57c;
    fVar151 = 0.0 - fVar267;
    fVar67 = 0.0 - fVar269;
    fVar110 = 0.0 - fVar271;
    fVar111 = 0.0 - fVar273;
    fVar208 = 0.0 - (float)local_3a8._0_4_;
    fVar229 = 0.0 - (float)local_3a8._4_4_;
    fVar230 = 0.0 - fStack_3a0;
    fVar231 = 0.0 - fStack_39c;
    auVar192._0_4_ = local_328 * local_3b8 * local_2f8 + local_3d8 * local_3c8 * local_2f8;
    auVar192._4_4_ = fStack_324 * fStack_3b4 * fStack_2f4 + fStack_3d4 * fStack_3c4 * fStack_2f4;
    auVar192._8_4_ = fStack_320 * fStack_3b0 * fStack_2f0 + fStack_3d0 * fStack_3c0 * fStack_2f0;
    auVar192._12_4_ = fStack_31c * fStack_3ac * fStack_2ec + fStack_3cc * fStack_3bc * fStack_2ec;
    local_3f8._0_4_ = local_2c8 * (float)local_3e8._0_4_ * local_2f8 + auVar192._0_4_;
    local_3f8._4_4_ = fStack_2c4 * (float)local_3e8._4_4_ * fStack_2f4 + auVar192._4_4_;
    local_3f8._8_4_ = fStack_2c0 * fStack_3e0 * fStack_2f0 + auVar192._8_4_;
    local_3f8._12_4_ = fStack_2bc * fStack_3dc * fStack_2ec + auVar192._12_4_;
    local_218 = (float)local_3e8._0_4_ * local_2f8 * fVar208 +
                local_3b8 * local_2f8 * fVar196 + local_3c8 * local_2f8 * fVar151;
    fStack_214 = (float)local_3e8._4_4_ * fStack_2f4 * fVar229 +
                 fStack_3b4 * fStack_2f4 * fVar197 + fStack_3c4 * fStack_2f4 * fVar67;
    fStack_210 = fStack_3e0 * fStack_2f0 * fVar230 +
                 fStack_3b0 * fStack_2f0 * fVar198 + fStack_3c0 * fStack_2f0 * fVar110;
    fStack_20c = fStack_3dc * fStack_2ec * fVar231 +
                 fStack_3ac * fStack_2ec * fVar206 + fStack_3bc * fStack_2ec * fVar111;
    fVar242 = (local_2c8 * fVar208 + local_328 * fVar196 + local_3d8 * fVar151) -
              (float)local_3f8._0_4_ * local_218;
    fVar243 = (fStack_2c4 * fVar229 + fStack_324 * fVar197 + fStack_3d4 * fVar67) -
              (float)local_3f8._4_4_ * fStack_214;
    fVar244 = (fStack_2c0 * fVar230 + fStack_320 * fVar198 + fStack_3d0 * fVar110) -
              (float)local_3f8._8_4_ * fStack_210;
    fVar251 = (fStack_2bc * fVar231 + fStack_31c * fVar206 + fStack_3cc * fVar111) -
              (float)local_3f8._12_4_ * fStack_20c;
    fVar152 = (fVar208 * fVar208 + fVar196 * fVar196 + fVar151 * fVar151) - local_218 * local_218;
    fVar167 = (fVar229 * fVar229 + fVar197 * fVar197 + fVar67 * fVar67) - fStack_214 * fStack_214;
    fVar169 = (fVar230 * fVar230 + fVar198 * fVar198 + fVar110 * fVar110) - fStack_210 * fStack_210;
    fVar189 = (fVar231 * fVar231 + fVar206 * fVar206 + fVar111 * fVar111) - fStack_20c * fStack_20c;
    fVar112 = (auVar226._0_4_ + auVar77._0_4_) * 1.0000002;
    fVar132 = (auVar226._4_4_ + auVar77._4_4_) * 1.0000002;
    fVar133 = (auVar226._8_4_ + auVar77._8_4_) * 1.0000002;
    fVar134 = (auVar226._12_4_ + auVar77._12_4_) * 1.0000002;
    auVar236._0_4_ = fVar152 - fVar112 * fVar112;
    auVar236._4_4_ = fVar167 - fVar132 * fVar132;
    auVar236._8_4_ = fVar169 - fVar133 * fVar133;
    auVar236._12_4_ = fVar189 - fVar134 * fVar134;
    local_2d8._0_4_ = (float)local_3f8._0_4_ * (float)local_3f8._0_4_;
    local_2d8._4_4_ = (float)local_3f8._4_4_ * (float)local_3f8._4_4_;
    fStack_2d0 = (float)local_3f8._8_4_ * (float)local_3f8._8_4_;
    fStack_2cc = (float)local_3f8._12_4_ * (float)local_3f8._12_4_;
    local_338._0_4_ = local_128 - (float)local_2d8._0_4_;
    local_338._4_4_ = fStack_124 - (float)local_2d8._4_4_;
    fStack_330 = fStack_120 - fStack_2d0;
    fStack_32c = fStack_11c - fStack_2cc;
    fVar242 = fVar242 + fVar242;
    fVar243 = fVar243 + fVar243;
    fVar244 = fVar244 + fVar244;
    fVar251 = fVar251 + fVar251;
    local_398 = (float)local_338._0_4_ * 4.0;
    fStack_394 = (float)local_338._4_4_ * 4.0;
    fStack_390 = fStack_330 * 4.0;
    fStack_38c = fStack_32c * 4.0;
    auVar227._0_4_ = fVar242 * fVar242 - local_398 * auVar236._0_4_;
    auVar227._4_4_ = fVar243 * fVar243 - fStack_394 * auVar236._4_4_;
    auVar227._8_4_ = fVar244 * fVar244 - fStack_390 * auVar236._8_4_;
    auVar227._12_4_ = fVar251 * fVar251 - fStack_38c * auVar236._12_4_;
    local_388 = (auVar234._0_4_ - auVar77._0_4_) * 0.99999976;
    fStack_384 = (auVar234._4_4_ - auVar77._4_4_) * 0.99999976;
    fStack_380 = (auVar234._8_4_ - auVar77._8_4_) * 0.99999976;
    fStack_37c = (auVar234._12_4_ - auVar77._12_4_) * 0.99999976;
    auVar138._4_4_ = -(uint)(0.0 <= auVar227._4_4_);
    auVar138._0_4_ = -(uint)(0.0 <= auVar227._0_4_);
    auVar138._8_4_ = -(uint)(0.0 <= auVar227._8_4_);
    auVar138._12_4_ = -(uint)(0.0 <= auVar227._12_4_);
    uVar51 = (undefined4)((ulong)lVar47 >> 0x20);
    iVar44 = movmskps((int)lVar47,auVar138);
    if (iVar44 == 0) {
      iVar44 = 0;
      auVar121 = _DAT_01feb9f0;
      auVar194 = _DAT_01feba00;
    }
    else {
      auVar234 = sqrtps(auVar236,auVar227);
      bVar9 = 0.0 <= auVar227._0_4_;
      uVar58 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar227._4_4_;
      uVar60 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar227._8_4_;
      uVar62 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar227._12_4_;
      uVar64 = -(uint)bVar12;
      auVar120._0_4_ = (float)local_338._0_4_ + (float)local_338._0_4_;
      auVar120._4_4_ = (float)local_338._4_4_ + (float)local_338._4_4_;
      auVar120._8_4_ = fStack_330 + fStack_330;
      auVar120._12_4_ = fStack_32c + fStack_32c;
      auVar77 = rcpps(auVar192,auVar120);
      fVar112 = auVar77._0_4_;
      fVar133 = auVar77._4_4_;
      fVar252 = auVar77._8_4_;
      fVar256 = auVar77._12_4_;
      fVar112 = (1.0 - auVar120._0_4_ * fVar112) * fVar112 + fVar112;
      fVar133 = (1.0 - auVar120._4_4_ * fVar133) * fVar133 + fVar133;
      fVar252 = (1.0 - auVar120._8_4_ * fVar252) * fVar252 + fVar252;
      fVar256 = (1.0 - auVar120._12_4_ * fVar256) * fVar256 + fVar256;
      fVar132 = (-fVar242 - auVar234._0_4_) * fVar112;
      fVar134 = (-fVar243 - auVar234._4_4_) * fVar133;
      fVar253 = (-fVar244 - auVar234._8_4_) * fVar252;
      fVar257 = (-fVar251 - auVar234._12_4_) * fVar256;
      fVar112 = (auVar234._0_4_ - fVar242) * fVar112;
      fVar133 = (auVar234._4_4_ - fVar243) * fVar133;
      fVar252 = (auVar234._8_4_ - fVar244) * fVar252;
      fVar256 = (auVar234._12_4_ - fVar251) * fVar256;
      local_288._4_4_ = ((float)local_3f8._4_4_ * fVar134 + fStack_214) * fStack_2f4;
      local_288._0_4_ = ((float)local_3f8._0_4_ * fVar132 + local_218) * local_2f8;
      fStack_280 = ((float)local_3f8._8_4_ * fVar253 + fStack_210) * fStack_2f0;
      fStack_27c = ((float)local_3f8._12_4_ * fVar257 + fStack_20c) * fStack_2ec;
      local_298._0_4_ = ((float)local_3f8._0_4_ * fVar112 + local_218) * local_2f8;
      local_298._4_4_ = ((float)local_3f8._4_4_ * fVar133 + fStack_214) * fStack_2f4;
      fStack_290 = ((float)local_3f8._8_4_ * fVar252 + fStack_210) * fStack_2f0;
      fStack_28c = ((float)local_3f8._12_4_ * fVar256 + fStack_20c) * fStack_2ec;
      auVar193._0_4_ = (uint)fVar132 & uVar58;
      auVar193._4_4_ = (uint)fVar134 & uVar60;
      auVar193._8_4_ = (uint)fVar253 & uVar62;
      auVar193._12_4_ = (uint)fVar257 & uVar64;
      auVar121._0_8_ = CONCAT44(~uVar60,~uVar58) & 0x7f8000007f800000;
      auVar121._8_4_ = ~uVar62 & 0x7f800000;
      auVar121._12_4_ = ~uVar64 & 0x7f800000;
      auVar121 = auVar121 | auVar193;
      auVar237._0_4_ = (uint)fVar112 & uVar58;
      auVar237._4_4_ = (uint)fVar133 & uVar60;
      auVar237._8_4_ = (uint)fVar252 & uVar62;
      auVar237._12_4_ = (uint)fVar256 & uVar64;
      auVar194._0_8_ = CONCAT44(~uVar60,~uVar58) & 0xff800000ff800000;
      auVar194._8_4_ = ~uVar62 & 0xff800000;
      auVar194._12_4_ = ~uVar64 & 0xff800000;
      auVar194 = auVar194 | auVar237;
      auVar238._0_8_ = CONCAT44(local_2d8._4_4_,local_2d8._0_4_) & 0x7fffffff7fffffff;
      auVar238._8_4_ = ABS(fStack_2d0);
      auVar238._12_4_ = ABS(fStack_2cc);
      auVar26._4_4_ = fStack_264;
      auVar26._0_4_ = local_268;
      auVar26._8_4_ = fStack_260;
      auVar26._12_4_ = fStack_25c;
      auVar77 = maxps(auVar26,auVar238);
      fVar112 = auVar77._0_4_ * 1.9073486e-06;
      fVar132 = auVar77._4_4_ * 1.9073486e-06;
      fVar133 = auVar77._8_4_ * 1.9073486e-06;
      fVar134 = auVar77._12_4_ * 1.9073486e-06;
      auVar239._0_4_ = -(uint)(ABS((float)local_338._0_4_) < fVar112 && bVar9);
      auVar239._4_4_ = -(uint)(ABS((float)local_338._4_4_) < fVar132 && bVar10);
      auVar239._8_4_ = -(uint)(ABS(fStack_330) < fVar133 && bVar11);
      auVar239._12_4_ = -(uint)(ABS(fStack_32c) < fVar134 && bVar12);
      iVar44 = movmskps(iVar44,auVar239);
      if (iVar44 != 0) {
        uVar58 = -(uint)(auVar236._0_4_ <= 0.0);
        uVar60 = -(uint)(auVar236._4_4_ <= 0.0);
        uVar62 = -(uint)(auVar236._8_4_ <= 0.0);
        uVar64 = -(uint)(auVar236._12_4_ <= 0.0);
        auVar275._0_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar239._0_4_;
        auVar275._4_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar239._4_4_;
        auVar275._8_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar239._8_4_;
        auVar275._12_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar239._12_4_;
        auVar278._0_4_ = ~auVar239._0_4_ & auVar121._0_4_;
        auVar278._4_4_ = ~auVar239._4_4_ & auVar121._4_4_;
        auVar278._8_4_ = ~auVar239._8_4_ & auVar121._8_4_;
        auVar278._12_4_ = ~auVar239._12_4_ & auVar121._12_4_;
        auVar173._0_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar239._0_4_;
        auVar173._4_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar239._4_4_;
        auVar173._8_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar239._8_4_;
        auVar173._12_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar239._12_4_;
        auVar240._0_4_ = ~auVar239._0_4_ & auVar194._0_4_;
        auVar240._4_4_ = ~auVar239._4_4_ & auVar194._4_4_;
        auVar240._8_4_ = ~auVar239._8_4_ & auVar194._8_4_;
        auVar240._12_4_ = ~auVar239._12_4_ & auVar194._12_4_;
        auVar138._0_4_ =
             -(uint)((fVar112 <= ABS((float)local_338._0_4_) || auVar236._0_4_ <= 0.0) && bVar9);
        auVar138._4_4_ =
             -(uint)((fVar132 <= ABS((float)local_338._4_4_) || auVar236._4_4_ <= 0.0) && bVar10);
        auVar138._8_4_ = -(uint)((fVar133 <= ABS(fStack_330) || auVar236._8_4_ <= 0.0) && bVar11);
        auVar138._12_4_ = -(uint)((fVar134 <= ABS(fStack_32c) || auVar236._12_4_ <= 0.0) && bVar12);
        auVar121 = auVar278 | auVar275;
        auVar194 = auVar240 | auVar173;
      }
    }
    auVar139._0_4_ = (auVar138._0_4_ << 0x1f) >> 0x1f;
    auVar139._4_4_ = (auVar138._4_4_ << 0x1f) >> 0x1f;
    auVar139._8_4_ = (auVar138._8_4_ << 0x1f) >> 0x1f;
    auVar139._12_4_ = (auVar138._12_4_ << 0x1f) >> 0x1f;
    auVar139 = auVar139 & local_1b8;
    iVar44 = movmskps(iVar44,auVar139);
    lVar47 = CONCAT44(uVar51,iVar44);
    if (iVar44 != 0) {
      auVar279._0_4_ = (ray->org).field_0.m128[3] - (float)local_2a8._0_4_;
      auVar279._4_4_ = auVar279._0_4_;
      auVar279._8_4_ = auVar279._0_4_;
      auVar279._12_4_ = auVar279._0_4_;
      auVar225 = maxps(auVar279,auVar121);
      auVar261._0_4_ = ray->tfar - (float)local_2a8._0_4_;
      auVar261._4_4_ = auVar261._0_4_;
      auVar261._8_4_ = auVar261._0_4_;
      auVar261._12_4_ = auVar261._0_4_;
      auVar234 = minps(auVar261,auVar194);
      auVar93._0_4_ = fVar151 * auVar260._0_4_;
      auVar93._4_4_ = fVar67 * auVar260._4_4_;
      auVar93._8_4_ = fVar110 * auVar260._8_4_;
      auVar93._12_4_ = fVar111 * auVar260._12_4_;
      auVar245._0_4_ =
           (float)local_598._0_4_ * local_2c8 + fVar207 * local_328 + auVar260._0_4_ * local_3d8;
      auVar245._4_4_ = local_528 * fStack_2c4 + local_4d8 * fStack_324 + auVar260._4_4_ * fStack_3d4
      ;
      auVar245._8_4_ =
           fStack_524 * fStack_2c0 + fStack_4d4 * fStack_320 + auVar260._8_4_ * fStack_3d0;
      auVar245._12_4_ =
           fStack_520 * fStack_2bc + fStack_4d0 * fStack_31c + auVar260._12_4_ * fStack_3cc;
      auVar77 = rcpps(auVar93,auVar245);
      fVar151 = auVar77._0_4_;
      fVar67 = auVar77._4_4_;
      fVar110 = auVar77._8_4_;
      fVar111 = auVar77._12_4_;
      fVar151 = ((fVar150 - auVar245._0_4_ * fVar151) * fVar151 + fVar151) *
                -(fVar208 * (float)local_598._0_4_ + fVar196 * fVar207 + auVar93._0_4_);
      fVar67 = ((fVar168 - auVar245._4_4_ * fVar67) * fVar67 + fVar67) *
               -(fVar229 * local_528 + fVar197 * local_4d8 + auVar93._4_4_);
      fVar110 = ((fVar187 - auVar245._8_4_ * fVar110) * fVar110 + fVar110) *
                -(fVar230 * fStack_524 + fVar198 * fStack_4d4 + auVar93._8_4_);
      fVar111 = ((fVar188 - auVar245._12_4_ * fVar111) * fVar111 + fVar111) *
                -(fVar231 * fStack_520 + fVar206 * fStack_4d0 + auVar93._12_4_);
      uVar58 = -(uint)(auVar245._0_4_ < 0.0 || ABS(auVar245._0_4_) < 1e-18);
      uVar60 = -(uint)(auVar245._4_4_ < 0.0 || ABS(auVar245._4_4_) < 1e-18);
      uVar62 = -(uint)(auVar245._8_4_ < 0.0 || ABS(auVar245._8_4_) < 1e-18);
      uVar64 = -(uint)(auVar245._12_4_ < 0.0 || ABS(auVar245._12_4_) < 1e-18);
      auVar195._0_8_ = CONCAT44(uVar60,uVar58) & 0xff800000ff800000;
      auVar195._8_4_ = uVar62 & 0xff800000;
      auVar195._12_4_ = uVar64 & 0xff800000;
      auVar94._0_4_ = ~uVar58 & (uint)fVar151;
      auVar94._4_4_ = ~uVar60 & (uint)fVar67;
      auVar94._8_4_ = ~uVar62 & (uint)fVar110;
      auVar94._12_4_ = ~uVar64 & (uint)fVar111;
      auVar225 = maxps(auVar225,auVar94 | auVar195);
      uVar58 = -(uint)(0.0 < auVar245._0_4_ || ABS(auVar245._0_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar245._4_4_ || ABS(auVar245._4_4_) < 1e-18);
      uVar62 = -(uint)(0.0 < auVar245._8_4_ || ABS(auVar245._8_4_) < 1e-18);
      uVar64 = -(uint)(0.0 < auVar245._12_4_ || ABS(auVar245._12_4_) < 1e-18);
      auVar95._0_8_ = CONCAT44(uVar60,uVar58) & 0x7f8000007f800000;
      auVar95._8_4_ = uVar62 & 0x7f800000;
      auVar95._12_4_ = uVar64 & 0x7f800000;
      auVar246._0_4_ = ~uVar58 & (uint)fVar151;
      auVar246._4_4_ = ~uVar60 & (uint)fVar67;
      auVar246._8_4_ = ~uVar62 & (uint)fVar110;
      auVar246._12_4_ = ~uVar64 & (uint)fVar111;
      auVar234 = minps(auVar234,auVar246 | auVar95);
      auVar122._0_4_ = (0.0 - fStack_584) * -local_4d8 + (0.0 - fVar269) * -auVar260._4_4_;
      auVar122._4_4_ = (0.0 - fStack_580) * -fStack_4d4 + (0.0 - fVar271) * -auVar260._8_4_;
      auVar122._8_4_ = (0.0 - fStack_57c) * -fStack_4d0 + (0.0 - fVar273) * -auVar260._12_4_;
      auVar122._12_4_ = 0x80000000;
      auVar174._0_4_ = -local_528 * local_2c8 + -local_4d8 * local_328 + -auVar260._4_4_ * local_3d8
      ;
      auVar174._4_4_ =
           -fStack_524 * fStack_2c4 + -fStack_4d4 * fStack_324 + -auVar260._8_4_ * fStack_3d4;
      auVar174._8_4_ =
           -fStack_520 * fStack_2c0 + -fStack_4d0 * fStack_320 + -auVar260._12_4_ * fStack_3d0;
      auVar174._12_4_ = fStack_2bc * -0.0 + fStack_31c * -0.0 + fStack_3cc * -0.0;
      auVar77 = rcpps(auVar122,auVar174);
      fVar151 = auVar77._0_4_;
      fVar67 = auVar77._4_4_;
      fVar110 = auVar77._8_4_;
      fVar111 = auVar77._12_4_;
      auVar157._4_4_ = -(uint)(ABS(auVar174._4_4_) < 1e-18);
      auVar157._0_4_ = -(uint)(ABS(auVar174._0_4_) < 1e-18);
      auVar157._8_4_ = -(uint)(ABS(auVar174._8_4_) < 1e-18);
      auVar157._12_4_ = -(uint)(ABS(auVar174._12_4_) < 1e-18);
      fVar151 = ((fVar150 - auVar174._0_4_ * fVar151) * fVar151 + fVar151) *
                -((0.0 - (float)local_3a8._4_4_) * -local_528 + auVar122._0_4_);
      fVar67 = ((fVar168 - auVar174._4_4_ * fVar67) * fVar67 + fVar67) *
               -((0.0 - fStack_3a0) * -fStack_524 + auVar122._4_4_);
      fVar110 = ((fVar187 - auVar174._8_4_ * fVar110) * fVar110 + fVar110) *
                -((0.0 - fStack_39c) * -fStack_520 + auVar122._8_4_);
      fVar111 = ((fVar188 - auVar174._12_4_ * fVar111) * fVar111 + fVar111) * 0.0;
      auVar96._4_4_ = -(uint)(auVar174._4_4_ < 0.0);
      auVar96._0_4_ = -(uint)(auVar174._0_4_ < 0.0);
      auVar96._8_4_ = -(uint)(auVar174._8_4_ < 0.0);
      auVar96._12_4_ = -(uint)(auVar174._12_4_ < 0.0);
      auVar96 = auVar96 | auVar157;
      auVar123._0_8_ = auVar96._0_8_ & 0xff800000ff800000;
      auVar123._8_4_ = auVar96._8_4_ & 0xff800000;
      auVar123._12_4_ = auVar96._12_4_ & 0xff800000;
      auVar97._0_4_ = ~auVar96._0_4_ & (uint)fVar151;
      auVar97._4_4_ = ~auVar96._4_4_ & (uint)fVar67;
      auVar97._8_4_ = ~auVar96._8_4_ & (uint)fVar110;
      auVar97._12_4_ = ~auVar96._12_4_ & (uint)fVar111;
      local_4e8 = maxps(auVar225,auVar97 | auVar123);
      auVar175._4_4_ = -(uint)(0.0 < auVar174._4_4_);
      auVar175._0_4_ = -(uint)(0.0 < auVar174._0_4_);
      auVar175._8_4_ = -(uint)(0.0 < auVar174._8_4_);
      auVar175._12_4_ = -(uint)(0.0 < auVar174._12_4_);
      auVar175 = auVar175 | auVar157;
      auVar98._0_8_ = auVar175._0_8_ & 0x7f8000007f800000;
      auVar98._8_4_ = auVar175._8_4_ & 0x7f800000;
      auVar98._12_4_ = auVar175._12_4_ & 0x7f800000;
      auVar176._0_4_ = ~auVar175._0_4_ & (uint)fVar151;
      auVar176._4_4_ = ~auVar175._4_4_ & (uint)fVar67;
      auVar176._8_4_ = ~auVar175._8_4_ & (uint)fVar110;
      auVar176._12_4_ = ~auVar175._12_4_ & (uint)fVar111;
      _local_578 = minps(auVar234,auVar176 | auVar98);
      fVar151 = local_4e8._0_4_;
      fVar67 = local_4e8._4_4_;
      fVar110 = local_4e8._8_4_;
      fVar111 = local_4e8._12_4_;
      uVar58 = -(uint)(fVar151 <= local_578._0_4_) & auVar139._0_4_;
      uVar60 = -(uint)(fVar67 <= local_578._4_4_) & auVar139._4_4_;
      uVar62 = -(uint)(fVar110 <= local_578._8_4_) & auVar139._8_4_;
      uVar64 = -(uint)(fVar111 <= local_578._12_4_) & auVar139._12_4_;
      auVar13._4_4_ = uVar60;
      auVar13._0_4_ = uVar58;
      auVar13._8_4_ = uVar62;
      auVar13._12_4_ = uVar64;
      iVar44 = movmskps(iVar44,auVar13);
      if (iVar44 != 0) {
        auVar23._4_4_ = fStack_384;
        auVar23._0_4_ = local_388;
        auVar23._8_4_ = fStack_380;
        auVar23._12_4_ = fStack_37c;
        auVar77 = maxps(ZEXT816(0),auVar23);
        auVar234 = minps(_local_288,_DAT_01feca10);
        auVar228._0_12_ = ZEXT812(0);
        auVar228._12_4_ = 0.0;
        auVar234 = maxps(auVar234,auVar228);
        auVar225 = minps(_local_298,_DAT_01feca10);
        auVar225 = maxps(auVar225,auVar228);
        local_288._0_4_ =
             (auVar234._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_368 + (float)local_2b8;
        local_288._4_4_ = (auVar234._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_368 + (float)local_2b8
        ;
        fStack_280 = (auVar234._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_368 + (float)local_2b8;
        fStack_27c = (auVar234._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_368 + (float)local_2b8;
        local_298._4_4_ = (auVar225._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_368 + (float)local_2b8
        ;
        local_298._0_4_ =
             (auVar225._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_368 + (float)local_2b8;
        fStack_290 = (auVar225._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_368 + (float)local_2b8;
        fStack_28c = (auVar225._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_368 + (float)local_2b8;
        fVar152 = fVar152 - auVar77._0_4_ * auVar77._0_4_;
        fVar167 = fVar167 - auVar77._4_4_ * auVar77._4_4_;
        fVar169 = fVar169 - auVar77._8_4_ * auVar77._8_4_;
        fVar189 = fVar189 - auVar77._12_4_ * auVar77._12_4_;
        auVar280._0_4_ = fVar242 * fVar242 - local_398 * fVar152;
        auVar280._4_4_ = fVar243 * fVar243 - fStack_394 * fVar167;
        auVar280._8_4_ = fVar244 * fVar244 - fStack_390 * fVar169;
        auVar280._12_4_ = fVar251 * fVar251 - fStack_38c * fVar189;
        local_2e8._4_4_ = -(uint)(0.0 <= auVar280._4_4_);
        local_2e8._0_4_ = -(uint)(0.0 <= auVar280._0_4_);
        local_2e8._8_4_ = -(uint)(0.0 <= auVar280._8_4_);
        local_2e8._12_4_ = -(uint)(0.0 <= auVar280._12_4_);
        iVar44 = movmskps(iVar44,local_2e8);
        if (iVar44 == 0) {
          fVar150 = 0.0;
          fVar168 = 0.0;
          fVar187 = 0.0;
          fVar188 = 0.0;
          fVar196 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          fVar206 = 0.0;
          fVar112 = 0.0;
          fVar132 = 0.0;
          fVar133 = 0.0;
          fVar134 = 0.0;
          fVar207 = 0.0;
          fVar208 = 0.0;
          fVar229 = 0.0;
          fVar230 = 0.0;
          _local_468 = ZEXT816(0);
          iVar44 = 0;
          auVar124 = _DAT_01feba00;
          auVar241 = _DAT_01feb9f0;
        }
        else {
          auVar234 = sqrtps(_DAT_01ff1da0,auVar280);
          auVar99._0_4_ = (float)local_338._0_4_ + (float)local_338._0_4_;
          auVar99._4_4_ = (float)local_338._4_4_ + (float)local_338._4_4_;
          auVar99._8_4_ = fStack_330 + fStack_330;
          auVar99._12_4_ = fStack_32c + fStack_32c;
          auVar77 = rcpps(_local_288,auVar99);
          fVar231 = auVar77._0_4_;
          fVar252 = auVar77._4_4_;
          fVar253 = auVar77._8_4_;
          fVar256 = auVar77._12_4_;
          fVar231 = (fVar150 - auVar99._0_4_ * fVar231) * fVar231 + fVar231;
          fVar252 = (fVar168 - auVar99._4_4_ * fVar252) * fVar252 + fVar252;
          fVar253 = (fVar187 - auVar99._8_4_ * fVar253) * fVar253 + fVar253;
          fVar256 = (fVar188 - auVar99._12_4_ * fVar256) * fVar256 + fVar256;
          fVar257 = (-fVar242 - auVar234._0_4_) * fVar231;
          fVar258 = (-fVar243 - auVar234._4_4_) * fVar252;
          fVar262 = (-fVar244 - auVar234._8_4_) * fVar253;
          fVar263 = (-fVar251 - auVar234._12_4_) * fVar256;
          fVar231 = (auVar234._0_4_ - fVar242) * fVar231;
          fVar252 = (auVar234._4_4_ - fVar243) * fVar252;
          fVar253 = (auVar234._8_4_ - fVar244) * fVar253;
          fVar256 = (auVar234._12_4_ - fVar251) * fVar256;
          fVar150 = ((float)local_3f8._0_4_ * fVar257 + local_218) * local_2f8;
          fVar168 = ((float)local_3f8._4_4_ * fVar258 + fStack_214) * fStack_2f4;
          fVar187 = ((float)local_3f8._8_4_ * fVar262 + fStack_210) * fStack_2f0;
          fVar188 = ((float)local_3f8._12_4_ * fVar263 + fStack_20c) * fStack_2ec;
          fVar112 = local_2c8 * fVar257 -
                    ((float)local_3e8._0_4_ * fVar150 + (float)local_3a8._0_4_);
          fVar132 = fStack_2c4 * fVar258 -
                    ((float)local_3e8._4_4_ * fVar168 + (float)local_3a8._4_4_);
          fVar133 = fStack_2c0 * fVar262 - (fStack_3e0 * fVar187 + fStack_3a0);
          fVar134 = fStack_2bc * fVar263 - (fStack_3dc * fVar188 + fStack_39c);
          local_598._4_4_ = fVar132;
          local_598._0_4_ = fVar112;
          fStack_590 = fVar133;
          fStack_58c = fVar134;
          fVar207 = local_328 * fVar257 - (local_3b8 * fVar150 + local_588);
          fVar208 = fStack_324 * fVar258 - (fStack_3b4 * fVar168 + fStack_584);
          fVar229 = fStack_320 * fVar262 - (fStack_3b0 * fVar187 + fStack_580);
          fVar230 = fStack_31c * fVar263 - (fStack_3ac * fVar188 + fStack_57c);
          local_468._4_4_ = fStack_3d4 * fVar258 - (fVar168 * fStack_3c4 + fVar269);
          local_468._0_4_ = local_3d8 * fVar257 - (fVar150 * local_3c8 + fVar267);
          fStack_460 = fStack_3d0 * fVar262 - (fVar187 * fStack_3c0 + fVar271);
          fStack_45c = fStack_3cc * fVar263 - (fVar188 * fStack_3bc + fVar273);
          local_2f8 = ((float)local_3f8._0_4_ * fVar231 + local_218) * local_2f8;
          fStack_2f4 = ((float)local_3f8._4_4_ * fVar252 + fStack_214) * fStack_2f4;
          fStack_2f0 = ((float)local_3f8._8_4_ * fVar253 + fStack_210) * fStack_2f0;
          fStack_2ec = ((float)local_3f8._12_4_ * fVar256 + fStack_20c) * fStack_2ec;
          auVar228._0_4_ =
               local_2c8 * fVar231 - ((float)local_3e8._0_4_ * local_2f8 + (float)local_3a8._0_4_);
          auVar228._4_4_ =
               fStack_2c4 * fVar252 - ((float)local_3e8._4_4_ * fStack_2f4 + (float)local_3a8._4_4_)
          ;
          auVar228._8_4_ = fStack_2c0 * fVar253 - (fStack_3e0 * fStack_2f0 + fStack_3a0);
          auVar228._12_4_ = fStack_2bc * fVar256 - (fStack_3dc * fStack_2ec + fStack_39c);
          fVar150 = local_328 * fVar231 - (local_3b8 * local_2f8 + local_588);
          fVar168 = fStack_324 * fVar252 - (fStack_3b4 * fStack_2f4 + fStack_584);
          fVar187 = fStack_320 * fVar253 - (fStack_3b0 * fStack_2f0 + fStack_580);
          fVar188 = fStack_31c * fVar256 - (fStack_3ac * fStack_2ec + fStack_57c);
          bVar9 = 0.0 <= auVar280._0_4_;
          uVar59 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar280._4_4_;
          uVar61 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar280._8_4_;
          uVar63 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar280._12_4_;
          uVar65 = -(uint)bVar12;
          fVar196 = local_3d8 * fVar231 - (local_2f8 * local_3c8 + fVar267);
          fVar197 = fStack_3d4 * fVar252 - (fStack_2f4 * fStack_3c4 + fVar269);
          fVar198 = fStack_3d0 * fVar253 - (fStack_2f0 * fStack_3c0 + fVar271);
          fVar206 = fStack_3cc * fVar256 - (fStack_2ec * fStack_3bc + fVar273);
          auVar247._0_4_ = (uint)fVar257 & uVar59;
          auVar247._4_4_ = (uint)fVar258 & uVar61;
          auVar247._8_4_ = (uint)fVar262 & uVar63;
          auVar247._12_4_ = (uint)fVar263 & uVar65;
          auVar241._0_8_ = CONCAT44(~uVar61,~uVar59) & 0x7f8000007f800000;
          auVar241._8_4_ = ~uVar63 & 0x7f800000;
          auVar241._12_4_ = ~uVar65 & 0x7f800000;
          auVar241 = auVar241 | auVar247;
          auVar177._0_4_ = (uint)fVar231 & uVar59;
          auVar177._4_4_ = (uint)fVar252 & uVar61;
          auVar177._8_4_ = (uint)fVar253 & uVar63;
          auVar177._12_4_ = (uint)fVar256 & uVar65;
          auVar124._0_8_ = CONCAT44(~uVar61,~uVar59) & 0xff800000ff800000;
          auVar124._8_4_ = ~uVar63 & 0xff800000;
          auVar124._12_4_ = ~uVar65 & 0xff800000;
          auVar124 = auVar124 | auVar177;
          auVar100._0_8_ = (ulong)local_2d8 & 0x7fffffff7fffffff;
          auVar100._8_4_ = ABS(fStack_2d0);
          auVar100._12_4_ = ABS(fStack_2cc);
          auVar27._4_4_ = fStack_264;
          auVar27._0_4_ = local_268;
          auVar27._8_4_ = fStack_260;
          auVar27._12_4_ = fStack_25c;
          auVar77 = maxps(auVar27,auVar100);
          fVar231 = auVar77._0_4_ * 1.9073486e-06;
          fVar242 = auVar77._4_4_ * 1.9073486e-06;
          fVar243 = auVar77._8_4_ * 1.9073486e-06;
          fVar244 = auVar77._12_4_ * 1.9073486e-06;
          auVar178._0_4_ = -(uint)(ABS((float)local_338._0_4_) < fVar231 && bVar9);
          auVar178._4_4_ = -(uint)(ABS((float)local_338._4_4_) < fVar242 && bVar10);
          auVar178._8_4_ = -(uint)(ABS(fStack_330) < fVar243 && bVar11);
          auVar178._12_4_ = -(uint)(ABS(fStack_32c) < fVar244 && bVar12);
          iVar44 = movmskps(iVar44,auVar178);
          if (iVar44 != 0) {
            uVar59 = -(uint)(fVar152 <= 0.0);
            uVar61 = -(uint)(fVar167 <= 0.0);
            uVar63 = -(uint)(fVar169 <= 0.0);
            uVar65 = -(uint)(fVar189 <= 0.0);
            auVar254._0_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar178._0_4_;
            auVar254._4_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar178._4_4_;
            auVar254._8_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar178._8_4_;
            auVar254._12_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar178._12_4_;
            auVar250._0_4_ = ~auVar178._0_4_ & auVar241._0_4_;
            auVar250._4_4_ = ~auVar178._4_4_ & auVar241._4_4_;
            auVar250._8_4_ = ~auVar178._8_4_ & auVar241._8_4_;
            auVar250._12_4_ = ~auVar178._12_4_ & auVar241._12_4_;
            auVar241 = auVar250 | auVar254;
            auVar255._0_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar178._0_4_;
            auVar255._4_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar178._4_4_;
            auVar255._8_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar178._8_4_;
            auVar255._12_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar178._12_4_;
            auVar186._0_4_ = ~auVar178._0_4_ & auVar124._0_4_;
            auVar186._4_4_ = ~auVar178._4_4_ & auVar124._4_4_;
            auVar186._8_4_ = ~auVar178._8_4_ & auVar124._8_4_;
            auVar186._12_4_ = ~auVar178._12_4_ & auVar124._12_4_;
            auVar124 = auVar186 | auVar255;
            local_2e8._4_4_ =
                 -(uint)((fVar242 <= ABS((float)local_338._4_4_) || fVar167 <= 0.0) && bVar10);
            local_2e8._0_4_ =
                 -(uint)((fVar231 <= ABS((float)local_338._0_4_) || fVar152 <= 0.0) && bVar9);
            local_2e8._8_4_ = -(uint)((fVar243 <= ABS(fStack_330) || fVar169 <= 0.0) && bVar11);
            local_2e8._12_4_ = -(uint)((fVar244 <= ABS(fStack_32c) || fVar189 <= 0.0) && bVar12);
          }
        }
        fVar152 = (ray->dir).field_0.m128[0];
        fVar167 = (ray->dir).field_0.m128[1];
        fVar169 = (ray->dir).field_0.m128[2];
        _local_118 = local_4e8;
        local_108 = minps(_local_578,auVar241);
        _local_248 = maxps(local_4e8,auVar124);
        local_238 = _local_578;
        local_308._0_8_ =
             CONCAT44(-(uint)(fVar67 <= local_108._4_4_) & uVar60,
                      -(uint)(fVar151 <= local_108._0_4_) & uVar58);
        local_308._8_4_ = -(uint)(fVar110 <= local_108._8_4_) & uVar62;
        local_308._12_4_ = -(uint)(fVar111 <= local_108._12_4_) & uVar64;
        _local_3e8 = _local_248;
        local_318._0_8_ =
             CONCAT44(-(uint)(local_248._4_4_ <= local_578._4_4_) & uVar60,
                      -(uint)(local_248._0_4_ <= local_578._0_4_) & uVar58);
        local_318._8_4_ = -(uint)(local_248._8_4_ <= local_578._8_4_) & uVar62;
        local_318._12_4_ = -(uint)(local_248._12_4_ <= local_578._12_4_) & uVar64;
        fStack_2d0 = (float)local_308._8_4_;
        local_2d8 = (undefined1  [8])local_308._0_8_;
        fStack_2cc = (float)local_308._12_4_;
        auVar125._8_4_ = local_318._8_4_;
        auVar125._0_8_ = local_318._0_8_;
        auVar125._12_4_ = local_318._12_4_;
        iVar44 = movmskps(iVar44,auVar125 | _local_2d8);
        if (iVar44 != 0) {
          _local_338 = local_318;
          local_3f8._4_4_ =
               -(uint)(0.3 <= ABS(auVar228._4_4_ * fVar152 + fVar168 * fVar167 + fVar197 * fVar169))
          ;
          local_3f8._0_4_ =
               -(uint)(0.3 <= ABS(auVar228._0_4_ * fVar152 + fVar150 * fVar167 + fVar196 * fVar169))
          ;
          local_3f8._8_4_ =
               -(uint)(0.3 <= ABS(auVar228._8_4_ * fVar152 + fVar187 * fVar167 + fVar198 * fVar169))
          ;
          local_3f8._12_4_ =
               -(uint)(0.3 <= ABS(auVar228._12_4_ * fVar152 + fVar188 * fVar167 + fVar206 * fVar169)
                      );
          local_2f8 = (float)(int)local_4a0;
          fStack_2f4 = (float)(int)local_4a0;
          fStack_2f0 = (float)(int)local_4a0;
          fStack_2ec = (float)(int)local_4a0;
          local_468._0_4_ =
               -(uint)((int)local_4a0 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_468._0_4_ * fVar169 +
                                                 fVar207 * fVar167 + fVar112 * fVar152)) &
                             local_2e8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_468._4_4_ =
               -(uint)((int)local_4a0 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_468._4_4_ * fVar169 +
                                                 fVar208 * fVar167 + fVar132 * fVar152)) &
                             local_2e8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_460 = (float)-(uint)((int)local_4a0 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_460 * fVar169 +
                                                                fVar229 * fVar167 +
                                                                fVar133 * fVar152)) &
                                            local_2e8._8_4_) << 0x1f) >> 0x1f) + 4);
          fStack_45c = (float)-(uint)((int)local_4a0 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_45c * fVar169 +
                                                                fVar230 * fVar167 +
                                                                fVar134 * fVar152)) &
                                            local_2e8._12_4_) << 0x1f) >> 0x1f) + 4);
          local_308 = ~_local_468 & _local_2d8;
          iVar44 = movmskps(iVar44,local_308);
          if (iVar44 != 0) {
            local_3c8 = local_558 + fVar151;
            fStack_3c4 = fStack_554 + fVar67;
            fStack_3c0 = fStack_550 + fVar110;
            fStack_3bc = fStack_54c + fVar111;
            do {
              auVar234 = ~local_308 & _DAT_01feb9f0 | local_308 & local_4e8;
              auVar158._4_4_ = auVar234._0_4_;
              auVar158._0_4_ = auVar234._4_4_;
              auVar158._8_4_ = auVar234._12_4_;
              auVar158._12_4_ = auVar234._8_4_;
              auVar77 = minps(auVar158,auVar234);
              auVar126._0_8_ = auVar77._8_8_;
              auVar126._8_4_ = auVar77._0_4_;
              auVar126._12_4_ = auVar77._4_4_;
              auVar77 = minps(auVar126,auVar77);
              auVar127._0_8_ =
                   CONCAT44(-(uint)(auVar77._4_4_ == auVar234._4_4_) & local_308._4_4_,
                            -(uint)(auVar77._0_4_ == auVar234._0_4_) & local_308._0_4_);
              auVar127._8_4_ = -(uint)(auVar77._8_4_ == auVar234._8_4_) & local_308._8_4_;
              auVar127._12_4_ = -(uint)(auVar77._12_4_ == auVar234._12_4_) & local_308._12_4_;
              iVar44 = movmskps(iVar44,auVar127);
              auVar101 = local_308;
              if (iVar44 != 0) {
                auVar101._8_4_ = auVar127._8_4_;
                auVar101._0_8_ = auVar127._0_8_;
                auVar101._12_4_ = auVar127._12_4_;
              }
              uVar45 = movmskps(iVar44,auVar101);
              lVar47 = 0;
              if (CONCAT44(uVar51,uVar45) != 0) {
                for (; (CONCAT44(uVar51,uVar45) >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
                }
              }
              *(undefined4 *)(local_308 + lVar47 * 4) = 0;
              fVar151 = *(float *)(local_288 + lVar47 * 4);
              fVar67 = *(float *)(local_118 + lVar47 * 4);
              fVar110 = (ray->dir).field_0.m128[0];
              fVar111 = (ray->dir).field_0.m128[1];
              fVar112 = (ray->dir).field_0.m128[2];
              local_568 = (ray->dir).field_0.field_1;
              fVar110 = fVar112 * fVar112 + fVar111 * fVar111 + fVar110 * fVar110;
              if (fVar110 < 0.0) {
                fVar110 = sqrtf(fVar110);
                lVar47 = extraout_RAX;
              }
              else {
                fVar110 = SQRT(fVar110);
              }
              auVar15._4_4_ = fStack_504;
              auVar15._0_4_ = local_508;
              auVar15._8_4_ = fStack_500;
              auVar15._12_4_ = fStack_4fc;
              auVar21._4_4_ = fStack_434;
              auVar21._0_4_ = local_438;
              auVar21._8_4_ = fStack_430;
              auVar21._12_4_ = fStack_42c;
              auVar234 = minps(auVar15,auVar21);
              auVar225 = maxps(auVar15,auVar21);
              auVar19._4_4_ = fStack_444;
              auVar19._0_4_ = local_448;
              auVar19._8_4_ = fStack_440;
              auVar19._12_4_ = fStack_43c;
              auVar17._4_4_ = fStack_454;
              auVar17._0_4_ = local_458;
              auVar17._8_4_ = fStack_450;
              auVar17._12_4_ = fStack_44c;
              auVar77 = minps(auVar19,auVar17);
              auVar234 = minps(auVar234,auVar77);
              auVar77 = maxps(auVar19,auVar17);
              auVar77 = maxps(auVar225,auVar77);
              auVar179._0_8_ = auVar234._0_8_ & 0x7fffffff7fffffff;
              auVar179._8_4_ = auVar234._8_4_ & 0x7fffffff;
              auVar179._12_4_ = auVar234._12_4_ & 0x7fffffff;
              local_3b8 = auVar77._12_4_;
              auVar102._0_8_ = auVar77._0_8_ & 0x7fffffff7fffffff;
              auVar102._8_4_ = auVar77._8_4_ & 0x7fffffff;
              auVar102._12_4_ = ABS(local_3b8);
              auVar77 = maxps(auVar179,auVar102);
              fVar111 = auVar77._4_4_;
              if (auVar77._4_4_ <= auVar77._0_4_) {
                fVar111 = auVar77._0_4_;
              }
              auVar180._8_8_ = auVar77._8_8_;
              auVar180._0_8_ = auVar77._8_8_;
              if (auVar77._8_4_ <= fVar111) {
                auVar180._0_4_ = fVar111;
              }
              register0x00001304 = auVar180._4_12_;
              local_4b8._0_4_ = auVar180._0_4_ * 1.9073486e-06;
              local_398 = fVar110 * 1.9073486e-06;
              fStack_3b4 = local_3b8;
              fStack_3b0 = local_3b8;
              fStack_3ac = local_3b8;
              lVar55 = 5;
              do {
                fVar167 = 1.0 - fVar151;
                fVar133 = local_438 * fVar167 + local_448 * fVar151;
                fVar134 = fStack_434 * fVar167 + fStack_444 * fVar151;
                fVar150 = fStack_430 * fVar167 + fStack_440 * fVar151;
                fVar152 = fStack_42c * fVar167 + fStack_43c * fVar151;
                fVar110 = (local_508 * fVar167 + local_438 * fVar151) * fVar167 + fVar151 * fVar133;
                fVar111 = (fStack_504 * fVar167 + fStack_434 * fVar151) * fVar167 +
                          fVar151 * fVar134;
                fVar112 = (fStack_500 * fVar167 + fStack_430 * fVar151) * fVar167 +
                          fVar151 * fVar150;
                fVar132 = (fStack_4fc * fVar167 + fStack_42c * fVar151) * fVar167 +
                          fVar151 * fVar152;
                fVar133 = fVar133 * fVar167 + (local_448 * fVar167 + local_458 * fVar151) * fVar151;
                fVar134 = fVar134 * fVar167 +
                          (fStack_444 * fVar167 + fStack_454 * fVar151) * fVar151;
                fVar150 = fVar150 * fVar167 +
                          (fStack_440 * fVar167 + fStack_450 * fVar151) * fVar151;
                fVar152 = fVar152 * fVar167 +
                          (fStack_43c * fVar167 + fStack_44c * fVar151) * fVar151;
                local_358._0_4_ = fVar167 * fVar110 + fVar151 * fVar133;
                local_358._4_4_ = fVar167 * fVar111 + fVar151 * fVar134;
                fStack_350 = fVar167 * fVar112 + fVar151 * fVar150;
                fStack_34c = fVar167 * fVar132 + fVar151 * fVar152;
                local_578._0_4_ = (fVar133 - fVar110) * 3.0;
                local_578._4_4_ = (fVar134 - fVar111) * 3.0;
                fStack_570 = (fVar150 - fVar112) * 3.0;
                fStack_56c = (fVar152 - fVar132) * 3.0;
                local_4c8._0_4_ = (fVar67 * local_568.x + 0.0) - (float)local_358._0_4_;
                local_4c8._4_4_ = (fVar67 * local_568.y + 0.0) - (float)local_358._4_4_;
                fStack_4c0 = (fVar67 * local_568.z + 0.0) - fStack_350;
                fStack_4bc = (fVar67 * local_568.field_3.w + 0.0) - fStack_34c;
                fVar110 = (float)local_4c8._4_4_ * (float)local_4c8._4_4_;
                fVar111 = fStack_4c0 * fStack_4c0;
                fVar112 = fStack_4bc * fStack_4bc;
                local_598._0_4_ =
                     fVar110 + (float)local_4c8._0_4_ * (float)local_4c8._0_4_ + fVar111;
                local_598._4_4_ = fVar110 + fVar110 + fVar112;
                fStack_590 = fVar110 + fVar111 + fVar111;
                fStack_58c = fVar110 + fVar112 + fVar112;
                local_388 = (float)local_598._0_4_;
                if ((float)local_598._0_4_ < 0.0) {
                  fVar110 = sqrtf((float)local_598._0_4_);
                  lVar47 = extraout_RAX_00;
                  fVar111 = (float)local_578._0_4_;
                  fVar112 = (float)local_578._4_4_;
                  fVar132 = fStack_570;
                  fVar133 = fStack_56c;
                }
                else {
                  fVar110 = SQRT((float)local_598._0_4_);
                  fVar111 = (float)local_578._0_4_;
                  fVar112 = (float)local_578._4_4_;
                  fVar132 = fStack_570;
                  fVar133 = fStack_56c;
                }
                fVar168 = fVar167 * 6.0;
                fVar134 = (fVar151 - (fVar167 + fVar167)) * 6.0;
                fVar152 = (fVar167 - (fVar151 + fVar151)) * 6.0;
                fVar150 = fVar151 * 6.0;
                fVar167 = fVar168 * local_508 +
                          fVar134 * local_438 + fVar152 * local_448 + fVar150 * local_458;
                fVar169 = fVar168 * fStack_504 +
                          fVar134 * fStack_434 + fVar152 * fStack_444 + fVar150 * fStack_454;
                fVar187 = fVar168 * fStack_500 +
                          fVar134 * fStack_430 + fVar152 * fStack_440 + fVar150 * fStack_450;
                local_4d8 = (float)local_4b8._0_4_;
                if ((float)local_4b8._0_4_ <= local_398 * fVar67) {
                  local_4d8 = local_398 * fVar67;
                }
                fVar188 = fVar112 * fVar112 + fVar111 * fVar111 + fVar132 * fVar132;
                auVar234 = ZEXT416((uint)fVar188);
                auVar77 = rsqrtss(ZEXT416((uint)fVar188),auVar234);
                fVar189 = auVar77._0_4_;
                fVar189 = fVar189 * fVar189 * fVar188 * -0.5 * fVar189 + fVar189 * 1.5;
                fVar196 = fVar132 * fVar187 + fVar112 * fVar169 + fVar111 * fVar167;
                auVar77 = rcpss(auVar234,auVar234);
                fVar197 = (2.0 - fVar188 * auVar77._0_4_) * auVar77._0_4_;
                local_588 = fVar111 * fVar189;
                fStack_584 = fVar112 * fVar189;
                fStack_580 = fVar132 * fVar189;
                fStack_57c = fVar133 * fVar189;
                local_538._0_4_ = fVar197 * (fVar188 * fVar167 - fVar196 * fVar111) * fVar189;
                local_538._4_4_ = fVar197 * (fVar188 * fVar169 - fVar196 * fVar112) * fVar189;
                fStack_530 = fVar197 * (fVar188 * fVar187 - fVar196 * fVar132) * fVar189;
                fStack_4d4 = (float)local_4b8._4_4_;
                fStack_4d0 = fStack_4b0;
                uStack_4cc = uStack_4ac;
                if (fVar188 < 0.0) {
                  fStack_52c = fVar197 * (fVar188 * (fVar168 * fStack_4fc +
                                                    fVar134 * fStack_42c +
                                                    fVar152 * fStack_43c + fVar150 * fStack_44c) -
                                         fVar196 * fVar133) * fVar189;
                  local_528 = fVar110;
                  fVar188 = sqrtf(fVar188);
                  lVar47 = extraout_RAX_01;
                  fVar110 = local_528;
                }
                else {
                  fVar188 = SQRT(fVar188);
                }
                fVar134 = (float)local_4c8._4_4_ * fStack_584;
                fVar150 = fStack_4c0 * fStack_580;
                fStack_52c = fStack_4bc * fStack_57c;
                fVar152 = fVar134 + (float)local_4c8._0_4_ * local_588 + fVar150;
                fVar167 = fVar134 + fVar134 + fStack_52c;
                fVar150 = fVar134 + fVar150 + fVar150;
                fStack_52c = fVar134 + fStack_52c + fStack_52c;
                fVar110 = (fVar110 + 1.0) * ((float)local_4b8._0_4_ / fVar188) +
                          fVar110 * (float)local_4b8._0_4_ + local_4d8;
                fVar168 = local_568.x * local_588;
                fVar169 = local_568.y * fStack_584;
                fStack_360 = local_568.z * fStack_580;
                fVar134 = fStack_584 * -fVar112;
                fStack_580 = fStack_580 * -fVar132;
                fStack_584 = fStack_57c * -fVar133;
                local_588 = fStack_580 + fVar134 + local_588 * -fVar111 +
                            fStack_530 * fStack_4c0 +
                            (float)local_538._4_4_ * (float)local_4c8._4_4_ +
                            (float)local_538._0_4_ * (float)local_4c8._0_4_;
                local_368 = fStack_360 + fVar169 + fVar168;
                fVar134 = local_598._0_4_ - fVar152 * fVar152;
                auVar103._0_8_ = CONCAT44(local_598._4_4_ - fVar167 * fVar167,fVar134);
                auVar103._8_4_ = local_598._8_4_ - fVar150 * fVar150;
                auVar103._12_4_ = local_598._12_4_ - fStack_52c * fStack_52c;
                fVar168 = -fVar111 * (float)local_4c8._0_4_;
                fVar169 = -fVar112 * (float)local_4c8._4_4_;
                fVar132 = -fVar132 * fStack_4c0;
                fVar133 = -fVar133 * fStack_4bc;
                fVar111 = fVar152 * local_588;
                local_538._4_4_ = fVar167;
                local_538._0_4_ = fVar152;
                fStack_530 = fVar150;
                fStack_364 = local_568.field_3.w * fStack_57c;
                fStack_35c = local_568.field_3.w * fStack_57c;
                local_378 = (local_568.z * fStack_4c0 +
                            local_568.y * (float)local_4c8._4_4_ +
                            local_568.x * (float)local_4c8._0_4_) - fVar152 * local_368;
                fStack_374 = local_568.field_3.w * fStack_4bc;
                fStack_370 = local_568.z * fStack_4c0;
                fStack_36c = local_568.field_3.w * fStack_4bc;
                auVar159._8_4_ = auVar103._8_4_;
                auVar159._0_8_ = auVar103._0_8_;
                auVar159._12_4_ = auVar103._12_4_;
                auVar77 = rsqrtss(auVar159,auVar103);
                fVar112 = auVar77._0_4_;
                auVar160._4_12_ = auVar77._4_12_;
                auVar160._0_4_ = fVar112 * fVar112 * fVar134 * -0.5 * fVar112 + fVar112 * 1.5;
                fStack_57c = fStack_584;
                if (fVar134 < 0.0) {
                  local_528 = fVar110;
                  _local_3a8 = auVar160;
                  fVar134 = sqrtf(fVar134);
                  lVar47 = extraout_RAX_02;
                  auVar160 = _local_3a8;
                  fVar110 = local_528;
                }
                else {
                  fVar134 = SQRT(fVar134);
                }
                fVar134 = fVar134 - fStack_34c;
                fVar111 = ((fVar132 + fVar169 + fVar168) - fVar111) * auVar160._0_4_ - fStack_56c;
                auVar24._4_4_ = fStack_374;
                auVar24._0_4_ = local_378;
                auVar24._8_4_ = fStack_370;
                auVar24._12_4_ = fStack_36c;
                auVar140._4_12_ = auVar24._4_12_;
                auVar140._0_4_ = local_378 * auVar160._0_4_;
                auVar282._8_4_ = -fVar133;
                auVar282._0_8_ = CONCAT44(fVar133,fVar111) ^ 0x8000000000000000;
                auVar282._12_4_ = fStack_584;
                auVar281._8_8_ = auVar282._8_8_;
                auVar281._0_8_ = CONCAT44(local_588,fVar111) ^ 0x80000000;
                auVar161._0_4_ = local_588 * auVar140._0_4_ - local_368 * fVar111;
                auVar142._0_8_ = auVar140._0_8_;
                auVar142._8_4_ = fStack_374;
                auVar142._12_4_ = -fStack_364;
                auVar141._8_8_ = auVar142._8_8_;
                auVar141._0_8_ = CONCAT44(local_368,auVar140._0_4_) ^ 0x8000000000000000;
                auVar161._4_4_ = auVar161._0_4_;
                auVar161._8_4_ = auVar161._0_4_;
                auVar161._12_4_ = auVar161._0_4_;
                auVar77 = divps(auVar141,auVar161);
                auVar234 = divps(auVar281,auVar161);
                fVar151 = fVar151 - (auVar77._4_4_ * fVar134 +
                                    auVar77._0_4_ * (float)local_538._0_4_);
                fVar67 = fVar67 - (auVar234._4_4_ * fVar134 +
                                  auVar234._0_4_ * (float)local_538._0_4_);
                lVar47 = CONCAT71((int7)((ulong)lVar47 >> 8),1);
                if ((ABS((float)local_538._0_4_) < fVar110) &&
                   (ABS(fVar134) < local_3b8 * 1.9073486e-06 + local_4d8 + fVar110)) {
                  fVar67 = fVar67 + (float)local_2a8._0_4_;
                  if (((ray->org).field_0.m128[3] <= fVar67) &&
                     (((fVar110 = ray->tfar, fVar67 <= fVar110 && (0.0 <= fVar151)) &&
                      (fVar151 <= 1.0)))) {
                    auVar77 = rsqrtss(_local_598,_local_598);
                    fVar111 = auVar77._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_510].ptr;
                    if ((pGVar7->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar57 = 1;
                      }
                      else {
                        fVar111 = fVar111 * 1.5 + fVar111 * fVar111 * local_388 * -0.5 * fVar111;
                        fVar134 = (float)local_4c8._0_4_ * fVar111;
                        fVar152 = (float)local_4c8._4_4_ * fVar111;
                        fVar111 = fStack_4c0 * fVar111;
                        fVar112 = fStack_56c * fVar134 + (float)local_578._0_4_;
                        fVar132 = fStack_56c * fVar152 + (float)local_578._4_4_;
                        fVar133 = fStack_56c * fVar111 + fStack_570;
                        fVar150 = fVar152 * (float)local_578._0_4_ -
                                  (float)local_578._4_4_ * fVar134;
                        fVar152 = fVar111 * (float)local_578._4_4_ - fStack_570 * fVar152;
                        fVar111 = fVar134 * fStack_570 - (float)local_578._0_4_ * fVar111;
                        local_428._4_4_ = fVar112 * fVar150 - fVar152 * fVar133;
                        local_428._0_4_ = fVar133 * fVar111 - fVar150 * fVar132;
                        local_428._8_4_ = fVar132 * fVar152 - fVar111 * fVar112;
                        fStack_41c = fVar151;
                        local_418 = 0;
                        local_414 = (int)local_340;
                        local_410 = (int)local_510;
                        local_40c = context->user->instID[0];
                        local_408 = context->user->instPrimID[0];
                        ray->tfar = fVar67;
                        local_59c = 0xffffffff;
                        local_498.geometryUserPtr = pGVar7->userPtr;
                        local_498.valid = &local_59c;
                        local_498.context = context->user;
                        local_498.hit = (RTCHitN *)local_428;
                        local_498.N = 1;
                        local_498.ray = (RTCRayN *)ray;
                        if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b797c0:
                          p_Var8 = context->args->filter;
                          if (p_Var8 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              pRVar54 = &local_498;
                              (*p_Var8)(pRVar54);
                            }
                            if (*local_498.valid == 0) goto LAB_00b79812;
                          }
                          uVar57 = 1;
                        }
                        else {
                          pRVar54 = &local_498;
                          (*pGVar7->occlusionFilterN)(pRVar54);
                          if (*local_498.valid != 0) goto LAB_00b797c0;
LAB_00b79812:
                          uVar57 = 0;
                        }
                        if ((char)uVar57 == '\0') {
                          ray->tfar = fVar110;
                        }
                      }
                      lVar47 = 0;
                      goto LAB_00b7964b;
                    }
                  }
                  lVar47 = 0;
                  uVar57 = 0;
                }
LAB_00b7964b:
                bVar56 = (byte)uVar57;
                if ((char)lVar47 == '\0') goto LAB_00b79836;
                lVar55 = lVar55 + -1;
              } while (lVar55 != 0);
              bVar56 = 0;
LAB_00b79836:
              uVar57 = (ulong)(bVar56 & 1);
              fVar151 = ray->tfar;
              local_308._0_4_ = -(uint)(local_3c8 <= fVar151) & local_308._0_4_;
              local_308._4_4_ = -(uint)(fStack_3c4 <= fVar151) & local_308._4_4_;
              local_308._8_4_ = -(uint)(fStack_3c0 <= fVar151) & local_308._8_4_;
              local_308._12_4_ = -(uint)(fStack_3bc <= fVar151) & local_308._12_4_;
              bVar49 = bVar49 | bVar56 & 1;
              uVar51 = (undefined4)((ulong)lVar47 >> 0x20);
              iVar44 = movmskps((int)lVar47,local_308);
            } while (iVar44 != 0);
          }
          fVar151 = ray->tfar;
          local_3e8._0_4_ = -(uint)((float)local_3e8._0_4_ + local_558 <= fVar151) & local_338._0_4_
          ;
          local_3e8._4_4_ =
               -(uint)((float)local_3e8._4_4_ + fStack_554 <= fVar151) & local_338._4_4_;
          fStack_3e0 = (float)(-(uint)(fStack_3e0 + fStack_550 <= fVar151) & (uint)fStack_330);
          fStack_3dc = (float)(-(uint)(fStack_3dc + fStack_54c <= fVar151) & (uint)fStack_32c);
          local_3f8._0_4_ =
               -(uint)((int)local_2f8 <
                      ((int)((local_3f8._0_4_ & local_2e8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_3f8._4_4_ =
               -(uint)((int)fStack_2f4 <
                      ((int)((local_3f8._4_4_ & local_2e8._4_4_) << 0x1f) >> 0x1f) + 4);
          local_3f8._8_4_ =
               -(uint)((int)fStack_2f0 <
                      ((int)((local_3f8._8_4_ & local_2e8._8_4_) << 0x1f) >> 0x1f) + 4);
          local_3f8._12_4_ =
               -(uint)((int)fStack_2ec <
                      ((int)((local_3f8._12_4_ & local_2e8._12_4_) << 0x1f) >> 0x1f) + 4);
          local_318 = ~local_3f8 & _local_3e8;
          iVar44 = movmskps(0,local_318);
          if (iVar44 != 0) {
            local_4e8 = _local_248;
            local_3c8 = local_558 + (float)local_248._0_4_;
            fStack_3c4 = fStack_554 + (float)local_248._4_4_;
            fStack_3c0 = fStack_550 + fStack_240;
            fStack_3bc = fStack_54c + fStack_23c;
            do {
              auVar234 = ~local_318 & _DAT_01feb9f0 | local_318 & local_4e8;
              auVar162._4_4_ = auVar234._0_4_;
              auVar162._0_4_ = auVar234._4_4_;
              auVar162._8_4_ = auVar234._12_4_;
              auVar162._12_4_ = auVar234._8_4_;
              auVar77 = minps(auVar162,auVar234);
              auVar128._0_8_ = auVar77._8_8_;
              auVar128._8_4_ = auVar77._0_4_;
              auVar128._12_4_ = auVar77._4_4_;
              auVar77 = minps(auVar128,auVar77);
              auVar129._0_8_ =
                   CONCAT44(-(uint)(auVar77._4_4_ == auVar234._4_4_) & local_318._4_4_,
                            -(uint)(auVar77._0_4_ == auVar234._0_4_) & local_318._0_4_);
              auVar129._8_4_ = -(uint)(auVar77._8_4_ == auVar234._8_4_) & local_318._8_4_;
              auVar129._12_4_ = -(uint)(auVar77._12_4_ == auVar234._12_4_) & local_318._12_4_;
              iVar44 = movmskps(iVar44,auVar129);
              auVar104 = local_318;
              if (iVar44 != 0) {
                auVar104._8_4_ = auVar129._8_4_;
                auVar104._0_8_ = auVar129._0_8_;
                auVar104._12_4_ = auVar129._12_4_;
              }
              uVar45 = movmskps(iVar44,auVar104);
              lVar47 = 0;
              if (CONCAT44(uVar51,uVar45) != 0) {
                for (; (CONCAT44(uVar51,uVar45) >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
                }
              }
              *(undefined4 *)(local_318 + lVar47 * 4) = 0;
              fVar151 = *(float *)(local_298 + lVar47 * 4);
              fVar67 = *(float *)(local_238 + lVar47 * 4);
              fVar110 = (ray->dir).field_0.m128[0];
              fVar111 = (ray->dir).field_0.m128[1];
              fVar112 = (ray->dir).field_0.m128[2];
              local_568 = (ray->dir).field_0.field_1;
              fVar110 = fVar112 * fVar112 + fVar111 * fVar111 + fVar110 * fVar110;
              if (fVar110 < 0.0) {
                fVar110 = sqrtf(fVar110);
                lVar47 = extraout_RAX_03;
              }
              else {
                fVar110 = SQRT(fVar110);
              }
              auVar16._4_4_ = fStack_504;
              auVar16._0_4_ = local_508;
              auVar16._8_4_ = fStack_500;
              auVar16._12_4_ = fStack_4fc;
              auVar22._4_4_ = fStack_434;
              auVar22._0_4_ = local_438;
              auVar22._8_4_ = fStack_430;
              auVar22._12_4_ = fStack_42c;
              auVar234 = minps(auVar16,auVar22);
              auVar225 = maxps(auVar16,auVar22);
              auVar20._4_4_ = fStack_444;
              auVar20._0_4_ = local_448;
              auVar20._8_4_ = fStack_440;
              auVar20._12_4_ = fStack_43c;
              auVar18._4_4_ = fStack_454;
              auVar18._0_4_ = local_458;
              auVar18._8_4_ = fStack_450;
              auVar18._12_4_ = fStack_44c;
              auVar77 = minps(auVar20,auVar18);
              auVar234 = minps(auVar234,auVar77);
              auVar77 = maxps(auVar20,auVar18);
              auVar77 = maxps(auVar225,auVar77);
              auVar181._0_8_ = auVar234._0_8_ & 0x7fffffff7fffffff;
              auVar181._8_4_ = auVar234._8_4_ & 0x7fffffff;
              auVar181._12_4_ = auVar234._12_4_ & 0x7fffffff;
              local_3b8 = auVar77._12_4_;
              auVar105._0_8_ = auVar77._0_8_ & 0x7fffffff7fffffff;
              auVar105._8_4_ = auVar77._8_4_ & 0x7fffffff;
              auVar105._12_4_ = ABS(local_3b8);
              auVar77 = maxps(auVar181,auVar105);
              fVar111 = auVar77._4_4_;
              if (auVar77._4_4_ <= auVar77._0_4_) {
                fVar111 = auVar77._0_4_;
              }
              auVar182._8_8_ = auVar77._8_8_;
              auVar182._0_8_ = auVar77._8_8_;
              if (auVar77._8_4_ <= fVar111) {
                auVar182._0_4_ = fVar111;
              }
              register0x00001304 = auVar182._4_12_;
              local_4b8._0_4_ = auVar182._0_4_ * 1.9073486e-06;
              local_398 = fVar110 * 1.9073486e-06;
              fStack_3b4 = local_3b8;
              fStack_3b0 = local_3b8;
              fStack_3ac = local_3b8;
              lVar55 = 5;
              do {
                fVar167 = 1.0 - fVar151;
                fVar133 = local_438 * fVar167 + local_448 * fVar151;
                fVar134 = fStack_434 * fVar167 + fStack_444 * fVar151;
                fVar150 = fStack_430 * fVar167 + fStack_440 * fVar151;
                fVar152 = fStack_42c * fVar167 + fStack_43c * fVar151;
                fVar110 = (local_508 * fVar167 + local_438 * fVar151) * fVar167 + fVar151 * fVar133;
                fVar111 = (fStack_504 * fVar167 + fStack_434 * fVar151) * fVar167 +
                          fVar151 * fVar134;
                fVar112 = (fStack_500 * fVar167 + fStack_430 * fVar151) * fVar167 +
                          fVar151 * fVar150;
                fVar132 = (fStack_4fc * fVar167 + fStack_42c * fVar151) * fVar167 +
                          fVar151 * fVar152;
                fVar133 = fVar133 * fVar167 + (local_448 * fVar167 + local_458 * fVar151) * fVar151;
                fVar134 = fVar134 * fVar167 +
                          (fStack_444 * fVar167 + fStack_454 * fVar151) * fVar151;
                fVar150 = fVar150 * fVar167 +
                          (fStack_440 * fVar167 + fStack_450 * fVar151) * fVar151;
                fVar152 = fVar152 * fVar167 +
                          (fStack_43c * fVar167 + fStack_44c * fVar151) * fVar151;
                local_358._0_4_ = fVar167 * fVar110 + fVar151 * fVar133;
                local_358._4_4_ = fVar167 * fVar111 + fVar151 * fVar134;
                fStack_350 = fVar167 * fVar112 + fVar151 * fVar150;
                fStack_34c = fVar167 * fVar132 + fVar151 * fVar152;
                local_578._0_4_ = (fVar133 - fVar110) * 3.0;
                local_578._4_4_ = (fVar134 - fVar111) * 3.0;
                fStack_570 = (fVar150 - fVar112) * 3.0;
                fStack_56c = (fVar152 - fVar132) * 3.0;
                local_4c8._0_4_ = (fVar67 * local_568.x + 0.0) - (float)local_358._0_4_;
                local_4c8._4_4_ = (fVar67 * local_568.y + 0.0) - (float)local_358._4_4_;
                fStack_4c0 = (fVar67 * local_568.z + 0.0) - fStack_350;
                fStack_4bc = (fVar67 * local_568.field_3.w + 0.0) - fStack_34c;
                fVar110 = (float)local_4c8._4_4_ * (float)local_4c8._4_4_;
                fVar111 = fStack_4c0 * fStack_4c0;
                fVar112 = fStack_4bc * fStack_4bc;
                local_598._0_4_ =
                     fVar110 + (float)local_4c8._0_4_ * (float)local_4c8._0_4_ + fVar111;
                local_598._4_4_ = fVar110 + fVar110 + fVar112;
                fStack_590 = fVar110 + fVar111 + fVar111;
                fStack_58c = fVar110 + fVar112 + fVar112;
                local_388 = (float)local_598._0_4_;
                if ((float)local_598._0_4_ < 0.0) {
                  fVar110 = sqrtf((float)local_598._0_4_);
                  lVar47 = extraout_RAX_04;
                  fVar111 = (float)local_578._0_4_;
                  fVar112 = (float)local_578._4_4_;
                  fVar132 = fStack_570;
                  fVar133 = fStack_56c;
                }
                else {
                  fVar110 = SQRT((float)local_598._0_4_);
                  fVar111 = (float)local_578._0_4_;
                  fVar112 = (float)local_578._4_4_;
                  fVar132 = fStack_570;
                  fVar133 = fStack_56c;
                }
                fVar168 = fVar167 * 6.0;
                fVar134 = (fVar151 - (fVar167 + fVar167)) * 6.0;
                fVar152 = (fVar167 - (fVar151 + fVar151)) * 6.0;
                fVar150 = fVar151 * 6.0;
                fVar167 = fVar168 * local_508 +
                          fVar134 * local_438 + fVar152 * local_448 + fVar150 * local_458;
                fVar169 = fVar168 * fStack_504 +
                          fVar134 * fStack_434 + fVar152 * fStack_444 + fVar150 * fStack_454;
                fVar187 = fVar168 * fStack_500 +
                          fVar134 * fStack_430 + fVar152 * fStack_440 + fVar150 * fStack_450;
                local_4d8 = (float)local_4b8._0_4_;
                if ((float)local_4b8._0_4_ <= local_398 * fVar67) {
                  local_4d8 = local_398 * fVar67;
                }
                fVar188 = fVar112 * fVar112 + fVar111 * fVar111 + fVar132 * fVar132;
                auVar234 = ZEXT416((uint)fVar188);
                auVar77 = rsqrtss(ZEXT416((uint)fVar188),auVar234);
                fVar189 = auVar77._0_4_;
                fVar189 = fVar189 * fVar189 * fVar188 * -0.5 * fVar189 + fVar189 * 1.5;
                fVar196 = fVar132 * fVar187 + fVar112 * fVar169 + fVar111 * fVar167;
                auVar77 = rcpss(auVar234,auVar234);
                fVar197 = (2.0 - fVar188 * auVar77._0_4_) * auVar77._0_4_;
                local_588 = fVar111 * fVar189;
                fStack_584 = fVar112 * fVar189;
                fStack_580 = fVar132 * fVar189;
                fStack_57c = fVar133 * fVar189;
                local_538._0_4_ = fVar197 * (fVar188 * fVar167 - fVar196 * fVar111) * fVar189;
                local_538._4_4_ = fVar197 * (fVar188 * fVar169 - fVar196 * fVar112) * fVar189;
                fStack_530 = fVar197 * (fVar188 * fVar187 - fVar196 * fVar132) * fVar189;
                fStack_4d4 = (float)local_4b8._4_4_;
                fStack_4d0 = fStack_4b0;
                uStack_4cc = uStack_4ac;
                if (fVar188 < 0.0) {
                  fStack_52c = fVar197 * (fVar188 * (fVar168 * fStack_4fc +
                                                    fVar134 * fStack_42c +
                                                    fVar152 * fStack_43c + fVar150 * fStack_44c) -
                                         fVar196 * fVar133) * fVar189;
                  local_528 = fVar110;
                  fVar188 = sqrtf(fVar188);
                  lVar47 = extraout_RAX_05;
                  fVar110 = local_528;
                }
                else {
                  fVar188 = SQRT(fVar188);
                }
                fVar134 = (float)local_4c8._4_4_ * fStack_584;
                fVar150 = fStack_4c0 * fStack_580;
                fStack_52c = fStack_4bc * fStack_57c;
                fVar152 = fVar134 + (float)local_4c8._0_4_ * local_588 + fVar150;
                fVar167 = fVar134 + fVar134 + fStack_52c;
                fVar150 = fVar134 + fVar150 + fVar150;
                fStack_52c = fVar134 + fStack_52c + fStack_52c;
                fVar110 = (fVar110 + 1.0) * ((float)local_4b8._0_4_ / fVar188) +
                          fVar110 * (float)local_4b8._0_4_ + local_4d8;
                fVar168 = local_568.x * local_588;
                fVar169 = local_568.y * fStack_584;
                fStack_360 = local_568.z * fStack_580;
                fVar134 = fStack_584 * -fVar112;
                fStack_580 = fStack_580 * -fVar132;
                fStack_584 = fStack_57c * -fVar133;
                local_588 = fStack_580 + fVar134 + local_588 * -fVar111 +
                            fStack_530 * fStack_4c0 +
                            (float)local_538._4_4_ * (float)local_4c8._4_4_ +
                            (float)local_538._0_4_ * (float)local_4c8._0_4_;
                local_368 = fStack_360 + fVar169 + fVar168;
                fVar134 = local_598._0_4_ - fVar152 * fVar152;
                auVar106._0_8_ = CONCAT44(local_598._4_4_ - fVar167 * fVar167,fVar134);
                auVar106._8_4_ = local_598._8_4_ - fVar150 * fVar150;
                auVar106._12_4_ = local_598._12_4_ - fStack_52c * fStack_52c;
                fVar168 = -fVar111 * (float)local_4c8._0_4_;
                fVar169 = -fVar112 * (float)local_4c8._4_4_;
                fVar132 = -fVar132 * fStack_4c0;
                fVar133 = -fVar133 * fStack_4bc;
                fVar111 = fVar152 * local_588;
                local_538._4_4_ = fVar167;
                local_538._0_4_ = fVar152;
                fStack_530 = fVar150;
                fStack_364 = local_568.field_3.w * fStack_57c;
                fStack_35c = local_568.field_3.w * fStack_57c;
                local_378 = (local_568.z * fStack_4c0 +
                            local_568.y * (float)local_4c8._4_4_ +
                            local_568.x * (float)local_4c8._0_4_) - fVar152 * local_368;
                fStack_374 = local_568.field_3.w * fStack_4bc;
                fStack_370 = local_568.z * fStack_4c0;
                fStack_36c = local_568.field_3.w * fStack_4bc;
                auVar163._8_4_ = auVar106._8_4_;
                auVar163._0_8_ = auVar106._0_8_;
                auVar163._12_4_ = auVar106._12_4_;
                auVar77 = rsqrtss(auVar163,auVar106);
                fVar112 = auVar77._0_4_;
                auVar164._4_12_ = auVar77._4_12_;
                auVar164._0_4_ = fVar112 * fVar112 * fVar134 * -0.5 * fVar112 + fVar112 * 1.5;
                fStack_57c = fStack_584;
                if (fVar134 < 0.0) {
                  local_528 = fVar110;
                  _local_3a8 = auVar164;
                  fVar134 = sqrtf(fVar134);
                  lVar47 = extraout_RAX_06;
                  auVar164 = _local_3a8;
                  fVar110 = local_528;
                }
                else {
                  fVar134 = SQRT(fVar134);
                }
                fVar134 = fVar134 - fStack_34c;
                fVar111 = ((fVar132 + fVar169 + fVar168) - fVar111) * auVar164._0_4_ - fStack_56c;
                auVar25._4_4_ = fStack_374;
                auVar25._0_4_ = local_378;
                auVar25._8_4_ = fStack_370;
                auVar25._12_4_ = fStack_36c;
                auVar143._4_12_ = auVar25._4_12_;
                auVar143._0_4_ = local_378 * auVar164._0_4_;
                auVar249._8_4_ = -fVar133;
                auVar249._0_8_ = CONCAT44(fVar133,fVar111) ^ 0x8000000000000000;
                auVar249._12_4_ = fStack_584;
                auVar248._8_8_ = auVar249._8_8_;
                auVar248._0_8_ = CONCAT44(local_588,fVar111) ^ 0x80000000;
                auVar165._0_4_ = local_588 * auVar143._0_4_ - local_368 * fVar111;
                auVar145._0_8_ = auVar143._0_8_;
                auVar145._8_4_ = fStack_374;
                auVar145._12_4_ = -fStack_364;
                auVar144._8_8_ = auVar145._8_8_;
                auVar144._0_8_ = CONCAT44(local_368,auVar143._0_4_) ^ 0x8000000000000000;
                auVar165._4_4_ = auVar165._0_4_;
                auVar165._8_4_ = auVar165._0_4_;
                auVar165._12_4_ = auVar165._0_4_;
                auVar77 = divps(auVar144,auVar165);
                auVar234 = divps(auVar248,auVar165);
                fVar151 = fVar151 - (auVar77._4_4_ * fVar134 +
                                    auVar77._0_4_ * (float)local_538._0_4_);
                fVar67 = fVar67 - (auVar234._4_4_ * fVar134 +
                                  auVar234._0_4_ * (float)local_538._0_4_);
                lVar47 = CONCAT71((int7)((ulong)lVar47 >> 8),1);
                if ((ABS((float)local_538._0_4_) < fVar110) &&
                   (ABS(fVar134) < local_3b8 * 1.9073486e-06 + local_4d8 + fVar110)) {
                  fVar67 = fVar67 + (float)local_2a8._0_4_;
                  if (((ray->org).field_0.m128[3] <= fVar67) &&
                     (((fVar110 = ray->tfar, fVar67 <= fVar110 && (0.0 <= fVar151)) &&
                      (fVar151 <= 1.0)))) {
                    auVar77 = rsqrtss(_local_598,_local_598);
                    fVar111 = auVar77._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_510].ptr;
                    if ((pGVar7->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar57 = 1;
                      }
                      else {
                        fVar111 = fVar111 * 1.5 + fVar111 * fVar111 * local_388 * -0.5 * fVar111;
                        fVar134 = (float)local_4c8._0_4_ * fVar111;
                        fVar152 = (float)local_4c8._4_4_ * fVar111;
                        fVar111 = fStack_4c0 * fVar111;
                        fVar112 = fStack_56c * fVar134 + (float)local_578._0_4_;
                        fVar132 = fStack_56c * fVar152 + (float)local_578._4_4_;
                        fVar133 = fStack_56c * fVar111 + fStack_570;
                        fVar150 = fVar152 * (float)local_578._0_4_ -
                                  (float)local_578._4_4_ * fVar134;
                        fVar152 = fVar111 * (float)local_578._4_4_ - fStack_570 * fVar152;
                        fVar111 = fVar134 * fStack_570 - (float)local_578._0_4_ * fVar111;
                        local_428._4_4_ = fVar112 * fVar150 - fVar152 * fVar133;
                        local_428._0_4_ = fVar133 * fVar111 - fVar150 * fVar132;
                        local_428._8_4_ = fVar132 * fVar152 - fVar111 * fVar112;
                        fStack_41c = fVar151;
                        local_418 = 0;
                        local_414 = (int)local_340;
                        local_410 = (int)local_510;
                        local_40c = context->user->instID[0];
                        local_408 = context->user->instPrimID[0];
                        ray->tfar = fVar67;
                        local_59c = 0xffffffff;
                        local_498.geometryUserPtr = pGVar7->userPtr;
                        local_498.valid = &local_59c;
                        local_498.context = context->user;
                        local_498.hit = (RTCHitN *)local_428;
                        local_498.N = 1;
                        local_498.ray = (RTCRayN *)ray;
                        if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b7a21e:
                          p_Var8 = context->args->filter;
                          if (p_Var8 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              pRVar54 = &local_498;
                              (*p_Var8)(pRVar54);
                            }
                            if (*local_498.valid == 0) goto LAB_00b7a279;
                          }
                          uVar57 = 1;
                        }
                        else {
                          pRVar54 = &local_498;
                          (*pGVar7->occlusionFilterN)(pRVar54);
                          if (*local_498.valid != 0) goto LAB_00b7a21e;
LAB_00b7a279:
                          uVar57 = 0;
                        }
                        if ((char)uVar57 == '\0') {
                          ray->tfar = fVar110;
                        }
                      }
                      lVar47 = 0;
                      goto LAB_00b7a09f;
                    }
                  }
                  lVar47 = 0;
                  uVar57 = 0;
                }
LAB_00b7a09f:
                bVar56 = (byte)uVar57;
                if ((char)lVar47 == '\0') goto LAB_00b7a293;
                lVar55 = lVar55 + -1;
              } while (lVar55 != 0);
              bVar56 = 0;
LAB_00b7a293:
              uVar57 = (ulong)(bVar56 & 1);
              fVar151 = ray->tfar;
              local_318._0_4_ = -(uint)(local_3c8 <= fVar151) & local_318._0_4_;
              local_318._4_4_ = -(uint)(fStack_3c4 <= fVar151) & local_318._4_4_;
              local_318._8_4_ = -(uint)(fStack_3c0 <= fVar151) & local_318._8_4_;
              local_318._12_4_ = -(uint)(fStack_3bc <= fVar151) & local_318._12_4_;
              bVar49 = bVar49 | bVar56 & 1;
              uVar51 = (undefined4)((ulong)lVar47 >> 0x20);
              iVar44 = movmskps((int)lVar47,local_318);
            } while (iVar44 != 0);
          }
          fVar151 = ray->tfar;
          auVar183._0_4_ =
               local_468._0_4_ & local_2d8._0_4_ &
               -(uint)(local_558 + (float)local_118._0_4_ <= fVar151);
          auVar183._4_4_ =
               local_468._4_4_ & local_2d8._4_4_ &
               -(uint)(fStack_554 + (float)local_118._4_4_ <= fVar151);
          auVar183._8_4_ =
               (uint)fStack_460 & (uint)fStack_2d0 & -(uint)(fStack_550 + fStack_110 <= fVar151);
          auVar183._12_4_ =
               (uint)fStack_45c & (uint)fStack_2cc & -(uint)(fStack_54c + fStack_10c <= fVar151);
          auVar146._0_4_ =
               local_3f8._0_4_ & local_3e8._0_4_ &
               -(uint)(local_558 + (float)local_248._0_4_ <= fVar151);
          auVar146._4_4_ =
               local_3f8._4_4_ & local_3e8._4_4_ &
               -(uint)(fStack_554 + (float)local_248._4_4_ <= fVar151);
          auVar146._8_4_ =
               local_3f8._8_4_ & (uint)fStack_3e0 & -(uint)(fStack_550 + fStack_240 <= fVar151);
          auVar146._12_4_ =
               local_3f8._12_4_ & (uint)fStack_3dc & -(uint)(fStack_54c + fStack_23c <= fVar151);
          iVar44 = movmskps(0,auVar146 | auVar183);
          lVar47 = CONCAT44(uVar51,iVar44);
          if (iVar44 != 0) {
            lVar47 = uVar48 * 0x30;
            *(undefined1 (*) [16])(local_f8 + uVar48 * 0xc) = auVar146 | auVar183;
            auVar107._0_4_ = local_118._0_4_ & auVar183._0_4_;
            auVar107._4_4_ = local_118._4_4_ & auVar183._4_4_;
            auVar107._8_4_ = (uint)fStack_110 & auVar183._8_4_;
            auVar107._12_4_ = (uint)fStack_10c & auVar183._12_4_;
            auVar184._0_4_ = ~auVar183._0_4_ & local_248._0_4_;
            auVar184._4_4_ = ~auVar183._4_4_ & local_248._4_4_;
            auVar184._8_4_ = ~auVar183._8_4_ & (uint)fStack_240;
            auVar184._12_4_ = ~auVar183._12_4_ & (uint)fStack_23c;
            *(undefined1 (*) [16])(afStack_e8 + uVar48 * 0xc) = auVar184 | auVar107;
            *(undefined8 *)(local_d8 + uVar48 * 0xc) = local_2b8;
            local_d8[uVar48 * 0xc + 2] = (float)((int)local_4a0 + 1);
            uVar48 = (ulong)((int)uVar48 + 1);
          }
          goto LAB_00b7a39b;
        }
        iVar44 = 0;
      }
      lVar47 = CONCAT44(uVar51,iVar44);
    }
LAB_00b7a39b:
    fVar151 = ray->tfar;
    uVar46 = uVar48;
    do {
      if ((int)uVar46 == 0) {
        if (bVar49 != 0) {
          return local_5d9;
        }
        fVar151 = ray->tfar;
        auVar131._4_4_ = -(uint)(fStack_224 <= fVar151);
        auVar131._0_4_ = -(uint)(local_228 <= fVar151);
        auVar131._8_4_ = -(uint)(fStack_220 <= fVar151);
        auVar131._12_4_ = -(uint)(fStack_21c <= fVar151);
        uVar58 = movmskps((int)lVar47,auVar131);
        uVar58 = (uint)local_270 & uVar58;
        local_5d9 = uVar58 != 0;
        if (!local_5d9) {
          return local_5d9;
        }
        goto LAB_00b77df8;
      }
      uVar48 = (ulong)((int)uVar46 - 1);
      local_498.valid._0_4_ =
           -(uint)(local_558 + afStack_e8[uVar48 * 0xc] <= fVar151) & local_f8[uVar48 * 0xc];
      local_498.valid._4_4_ =
           -(uint)(fStack_554 + afStack_e8[uVar48 * 0xc + 1] <= fVar151) &
           local_f8[uVar48 * 0xc + 1];
      local_498.geometryUserPtr._0_4_ =
           -(uint)(fStack_550 + afStack_e8[uVar48 * 0xc + 2] <= fVar151) &
           local_f8[uVar48 * 0xc + 2];
      local_498.geometryUserPtr._4_4_ =
           -(uint)(fStack_54c + afStack_e8[uVar48 * 0xc + 3] <= fVar151) &
           (uint)afStack_e8[uVar48 * 0xc + -1];
      iVar44 = movmskps((int)lVar47,(undefined1  [16])local_498._0_16_);
      lVar47 = CONCAT44((int)((ulong)lVar47 >> 0x20),iVar44);
      if (iVar44 != 0) {
        auVar147._0_4_ = (uint)afStack_e8[uVar48 * 0xc] & (uint)local_498.valid;
        auVar147._4_4_ = (uint)afStack_e8[uVar48 * 0xc + 1] & local_498.valid._4_4_;
        auVar147._8_4_ = (uint)afStack_e8[uVar48 * 0xc + 2] & (uint)local_498.geometryUserPtr;
        auVar147._12_4_ = (uint)afStack_e8[uVar48 * 0xc + 3] & local_498.geometryUserPtr._4_4_;
        auVar166._0_8_ =
             CONCAT44(~local_498.valid._4_4_,~(uint)local_498.valid) & 0x7f8000007f800000;
        auVar166._8_4_ = ~(uint)local_498.geometryUserPtr & 0x7f800000;
        auVar166._12_4_ = ~local_498.geometryUserPtr._4_4_ & 0x7f800000;
        auVar166 = auVar166 | auVar147;
        auVar185._4_4_ = auVar166._0_4_;
        auVar185._0_4_ = auVar166._4_4_;
        auVar185._8_4_ = auVar166._12_4_;
        auVar185._12_4_ = auVar166._8_4_;
        auVar77 = minps(auVar185,auVar166);
        auVar148._0_8_ = auVar77._8_8_;
        auVar148._8_4_ = auVar77._0_4_;
        auVar148._12_4_ = auVar77._4_4_;
        auVar77 = minps(auVar148,auVar77);
        auVar149._0_8_ =
             CONCAT44(-(uint)(auVar77._4_4_ == auVar166._4_4_) & local_498.valid._4_4_,
                      -(uint)(auVar77._0_4_ == auVar166._0_4_) & (uint)local_498.valid);
        auVar149._8_4_ = -(uint)(auVar77._8_4_ == auVar166._8_4_) & (uint)local_498.geometryUserPtr;
        auVar149._12_4_ =
             -(uint)(auVar77._12_4_ == auVar166._12_4_) & local_498.geometryUserPtr._4_4_;
        iVar50 = movmskps((int)lVar52,auVar149);
        auVar130 = (undefined1  [16])local_498._0_16_;
        if (iVar50 != 0) {
          auVar130._8_4_ = auVar149._8_4_;
          auVar130._0_8_ = auVar149._0_8_;
          auVar130._12_4_ = auVar149._12_4_;
        }
        fVar67 = local_d8[uVar48 * 0xc];
        fVar110 = local_d8[uVar48 * 0xc + 1];
        uVar51 = movmskps(iVar50,auVar130);
        uVar53 = CONCAT44((int)((ulong)lVar52 >> 0x20),uVar51);
        lVar52 = 0;
        if (uVar53 != 0) {
          for (; (uVar53 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
          }
        }
        *(undefined4 *)((long)&local_498.valid + lVar52 * 4) = 0;
        iVar50 = movmskps((int)pRVar54,(undefined1  [16])local_498._0_16_);
        pRVar54 = (RTCFilterFunctionNArguments *)(ulong)(uint)local_d8[uVar48 * 0xc + 2];
        if (iVar50 == 0) {
          uVar46 = uVar48;
        }
        *(undefined1 (*) [16])(local_f8 + uVar48 * 0xc) = (undefined1  [16])local_498._0_16_;
        fVar110 = fVar110 - fVar67;
        local_428._0_4_ = fVar110 * 0.0 + fVar67;
        local_428._4_4_ = fVar110 * 0.33333334 + fVar67;
        local_428._8_4_ = fVar110 * 0.6666667 + fVar67;
        fStack_41c = fVar110 * 1.0 + fVar67;
        local_2b8 = *(undefined8 *)(local_428 + lVar52 * 4);
        uStack_2b0 = 0;
        uVar48 = uVar46;
        local_4a0 = pRVar54;
      }
      uVar46 = uVar48;
    } while ((char)iVar44 == '\0');
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }